

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  int iVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  byte bVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar63;
  long lVar64;
  Geometry *pGVar65;
  uint uVar66;
  ulong uVar67;
  ulong uVar68;
  byte bVar69;
  float fVar70;
  float fVar71;
  float fVar124;
  float fVar128;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar125;
  float fVar129;
  float fVar132;
  float fVar133;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar81 [16];
  float fVar126;
  float fVar127;
  float fVar130;
  float fVar131;
  float fVar134;
  float fVar135;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined4 uVar136;
  float fVar146;
  float fVar147;
  vint4 bi_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vint4 bi_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  vint4 bi;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  vint4 ai_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  vint4 ai;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [64];
  vint4 ai_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_554;
  ulong local_550;
  RayQueryContext *local_548;
  RayHit *local_540;
  ulong local_538;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  Precalculations *local_510;
  Primitive *local_508;
  RTCFilterFunctionNArguments local_500;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined8 local_4b0;
  undefined4 local_4a8;
  float local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  uint local_494;
  uint local_490;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar67 = (ulong)(byte)PVar8;
  fVar161 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar76 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  auVar162._0_4_ = fVar161 * auVar76._0_4_;
  auVar162._4_4_ = fVar161 * auVar76._4_4_;
  auVar162._8_4_ = fVar161 * auVar76._8_4_;
  auVar162._12_4_ = fVar161 * auVar76._12_4_;
  auVar81._0_4_ = fVar161 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar81._4_4_ = fVar161 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar81._8_4_ = fVar161 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar81._12_4_ = fVar161 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xb + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar67 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar68 = (ulong)(uint)((int)(uVar67 * 9) * 2);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 + uVar67 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar61 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar204._4_4_ = auVar81._0_4_;
  auVar204._0_4_ = auVar81._0_4_;
  auVar204._8_4_ = auVar81._0_4_;
  auVar204._12_4_ = auVar81._0_4_;
  auVar80 = vshufps_avx(auVar81,auVar81,0x55);
  auVar75 = vshufps_avx(auVar81,auVar81,0xaa);
  fVar161 = auVar75._0_4_;
  auVar152._0_4_ = fVar161 * auVar79._0_4_;
  fVar146 = auVar75._4_4_;
  auVar152._4_4_ = fVar146 * auVar79._4_4_;
  fVar147 = auVar75._8_4_;
  auVar152._8_4_ = fVar147 * auVar79._8_4_;
  fVar70 = auVar75._12_4_;
  auVar152._12_4_ = fVar70 * auVar79._12_4_;
  auVar148._0_4_ = auVar18._0_4_ * fVar161;
  auVar148._4_4_ = auVar18._4_4_ * fVar146;
  auVar148._8_4_ = auVar18._8_4_ * fVar147;
  auVar148._12_4_ = auVar18._12_4_ * fVar70;
  auVar137._0_4_ = auVar78._0_4_ * fVar161;
  auVar137._4_4_ = auVar78._4_4_ * fVar146;
  auVar137._8_4_ = auVar78._8_4_ * fVar147;
  auVar137._12_4_ = auVar78._12_4_ * fVar70;
  auVar75 = vfmadd231ps_fma(auVar152,auVar80,auVar74);
  auVar73 = vfmadd231ps_fma(auVar148,auVar80,auVar77);
  auVar80 = vfmadd231ps_fma(auVar137,auVar20,auVar80);
  auVar72 = vfmadd231ps_fma(auVar75,auVar204,auVar76);
  auVar73 = vfmadd231ps_fma(auVar73,auVar204,auVar17);
  auVar81 = vfmadd231ps_fma(auVar80,auVar19,auVar204);
  auVar205._4_4_ = auVar162._0_4_;
  auVar205._0_4_ = auVar162._0_4_;
  auVar205._8_4_ = auVar162._0_4_;
  auVar205._12_4_ = auVar162._0_4_;
  auVar80 = vshufps_avx(auVar162,auVar162,0x55);
  auVar75 = vshufps_avx(auVar162,auVar162,0xaa);
  fVar161 = auVar75._0_4_;
  auVar207._0_4_ = fVar161 * auVar79._0_4_;
  fVar146 = auVar75._4_4_;
  auVar207._4_4_ = fVar146 * auVar79._4_4_;
  fVar147 = auVar75._8_4_;
  auVar207._8_4_ = fVar147 * auVar79._8_4_;
  fVar70 = auVar75._12_4_;
  auVar207._12_4_ = fVar70 * auVar79._12_4_;
  auVar175._0_4_ = auVar18._0_4_ * fVar161;
  auVar175._4_4_ = auVar18._4_4_ * fVar146;
  auVar175._8_4_ = auVar18._8_4_ * fVar147;
  auVar175._12_4_ = auVar18._12_4_ * fVar70;
  auVar163._0_4_ = auVar78._0_4_ * fVar161;
  auVar163._4_4_ = auVar78._4_4_ * fVar146;
  auVar163._8_4_ = auVar78._8_4_ * fVar147;
  auVar163._12_4_ = auVar78._12_4_ * fVar70;
  auVar74 = vfmadd231ps_fma(auVar207,auVar80,auVar74);
  auVar79 = vfmadd231ps_fma(auVar175,auVar80,auVar77);
  auVar77 = vfmadd231ps_fma(auVar163,auVar80,auVar20);
  auVar18 = vfmadd231ps_fma(auVar74,auVar205,auVar76);
  auVar20 = vfmadd231ps_fma(auVar79,auVar205,auVar17);
  auVar192._8_4_ = 0x7fffffff;
  auVar192._0_8_ = 0x7fffffff7fffffff;
  auVar192._12_4_ = 0x7fffffff;
  auVar78 = vfmadd231ps_fma(auVar77,auVar205,auVar19);
  auVar76 = vandps_avx(auVar72,auVar192);
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  uVar68 = vcmpps_avx512vl(auVar76,auVar187,1);
  bVar11 = (bool)((byte)uVar68 & 1);
  auVar75._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar72._0_4_;
  bVar11 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar72._4_4_;
  bVar11 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar72._8_4_;
  bVar11 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar72._12_4_;
  auVar76 = vandps_avx(auVar73,auVar192);
  uVar68 = vcmpps_avx512vl(auVar76,auVar187,1);
  bVar11 = (bool)((byte)uVar68 & 1);
  auVar72._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar73._0_4_;
  bVar11 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar73._4_4_;
  bVar11 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar73._8_4_;
  bVar11 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar73._12_4_;
  auVar76 = vandps_avx(auVar81,auVar192);
  uVar68 = vcmpps_avx512vl(auVar76,auVar187,1);
  bVar11 = (bool)((byte)uVar68 & 1);
  auVar73._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar81._0_4_;
  bVar11 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar81._4_4_;
  bVar11 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar81._8_4_;
  bVar11 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar81._12_4_;
  auVar74 = vrcp14ps_avx512vl(auVar75);
  auVar188._8_4_ = 0x3f800000;
  auVar188._0_8_ = 0x3f8000003f800000;
  auVar188._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar75,auVar74,auVar188);
  auVar17 = vfmadd132ps_fma(auVar76,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar76 = vfnmadd213ps_fma(auVar72,auVar74,auVar188);
  auVar77 = vfmadd132ps_fma(auVar76,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar74,auVar188);
  auVar19 = vfmadd132ps_fma(auVar76,auVar74,auVar74);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar18);
  auVar181._0_4_ = auVar17._0_4_ * auVar76._0_4_;
  auVar181._4_4_ = auVar17._4_4_ * auVar76._4_4_;
  auVar181._8_4_ = auVar17._8_4_ * auVar76._8_4_;
  auVar181._12_4_ = auVar17._12_4_ * auVar76._12_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar76 = vpmovsxwd_avx(auVar74);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar18);
  auVar75 = vpbroadcastd_avx512vl();
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar74 = vpmovsxwd_avx(auVar79);
  auVar153._0_4_ = auVar17._0_4_ * auVar76._0_4_;
  auVar153._4_4_ = auVar17._4_4_ * auVar76._4_4_;
  auVar153._8_4_ = auVar17._8_4_ * auVar76._8_4_;
  auVar153._12_4_ = auVar17._12_4_ * auVar76._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar67 * -2 + 6);
  auVar76 = vpmovsxwd_avx(auVar17);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar20);
  auVar189._0_4_ = auVar77._0_4_ * auVar76._0_4_;
  auVar189._4_4_ = auVar77._4_4_ * auVar76._4_4_;
  auVar189._8_4_ = auVar77._8_4_ * auVar76._8_4_;
  auVar189._12_4_ = auVar77._12_4_ * auVar76._12_4_;
  auVar76 = vcvtdq2ps_avx(auVar74);
  auVar76 = vsubps_avx(auVar76,auVar20);
  auVar149._0_4_ = auVar77._0_4_ * auVar76._0_4_;
  auVar149._4_4_ = auVar77._4_4_ * auVar76._4_4_;
  auVar149._8_4_ = auVar77._8_4_ * auVar76._8_4_;
  auVar149._12_4_ = auVar77._12_4_ * auVar76._12_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar61 + uVar67 + 6);
  auVar76 = vpmovsxwd_avx(auVar77);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar78);
  auVar176._0_4_ = auVar19._0_4_ * auVar76._0_4_;
  auVar176._4_4_ = auVar19._4_4_ * auVar76._4_4_;
  auVar176._8_4_ = auVar19._8_4_ * auVar76._8_4_;
  auVar176._12_4_ = auVar19._12_4_ * auVar76._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar67 * 0x17 + 6);
  auVar76 = vpmovsxwd_avx(auVar18);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar78);
  auVar138._0_4_ = auVar19._0_4_ * auVar76._0_4_;
  auVar138._4_4_ = auVar19._4_4_ * auVar76._4_4_;
  auVar138._8_4_ = auVar19._8_4_ * auVar76._8_4_;
  auVar138._12_4_ = auVar19._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar181,auVar153);
  auVar74 = vpminsd_avx(auVar189,auVar149);
  auVar76 = vmaxps_avx(auVar76,auVar74);
  auVar74 = vpminsd_avx(auVar176,auVar138);
  uVar136 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar19._4_4_ = uVar136;
  auVar19._0_4_ = uVar136;
  auVar19._8_4_ = uVar136;
  auVar19._12_4_ = uVar136;
  auVar74 = vmaxps_avx512vl(auVar74,auVar19);
  auVar76 = vmaxps_avx(auVar76,auVar74);
  auVar20._8_4_ = 0x3f7ffffa;
  auVar20._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar20._12_4_ = 0x3f7ffffa;
  local_190 = vmulps_avx512vl(auVar76,auVar20);
  auVar76 = vpmaxsd_avx(auVar181,auVar153);
  auVar74 = vpmaxsd_avx(auVar189,auVar149);
  auVar76 = vminps_avx(auVar76,auVar74);
  auVar74 = vpmaxsd_avx(auVar176,auVar138);
  fVar161 = (ray->super_RayK<1>).tfar;
  auVar78._4_4_ = fVar161;
  auVar78._0_4_ = fVar161;
  auVar78._8_4_ = fVar161;
  auVar78._12_4_ = fVar161;
  auVar74 = vminps_avx512vl(auVar74,auVar78);
  auVar76 = vminps_avx(auVar76,auVar74);
  auVar80._8_4_ = 0x3f800003;
  auVar80._0_8_ = 0x3f8000033f800003;
  auVar80._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar80);
  uVar21 = vcmpps_avx512vl(local_190,auVar76,2);
  uVar68 = vpcmpgtd_avx512vl(auVar75,_DAT_01f7fcf0);
  uVar68 = ((byte)uVar21 & 0xf) & uVar68;
  if ((char)uVar68 != '\0') {
    local_540 = ray;
    local_548 = context;
    local_508 = prim;
    local_510 = pre;
    do {
      auVar95 = local_440;
      lVar25 = 0;
      for (uVar61 = uVar68; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar66 = *(uint *)(prim + 2);
      uVar63 = *(uint *)(prim + lVar25 * 4 + 6);
      local_550 = (ulong)uVar66;
      pGVar65 = (context->scene->geometries).items[uVar66].ptr;
      local_538 = (ulong)uVar63;
      uVar61 = (ulong)*(uint *)(*(long *)&pGVar65->field_0x58 +
                               pGVar65[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar63);
      p_Var10 = pGVar65[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar65[1].time_range.upper;
      local_4c0 = *(undefined1 (*) [16])(lVar25 + (long)p_Var10 * uVar61);
      local_4d0 = *(undefined1 (*) [16])(lVar25 + (uVar61 + 1) * (long)p_Var10);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar61 + 2) * (long)p_Var10);
      auVar76 = *pauVar3;
      local_520 = *(undefined8 *)*pauVar3;
      uStack_518 = *(undefined8 *)(*pauVar3 + 8);
      uVar68 = uVar68 - 1 & uVar68;
      pauVar4 = (undefined1 (*) [12])(lVar25 + (uVar61 + 3) * (long)p_Var10);
      local_220 = *(undefined8 *)*pauVar4;
      uStack_218 = *(undefined8 *)(*pauVar4 + 8);
      local_530 = (float)local_220;
      fStack_52c = (float)((ulong)local_220 >> 0x20);
      fStack_528 = (float)uStack_218;
      fStack_524 = (float)((ulong)uStack_218 >> 0x20);
      if (uVar68 != 0) {
        uVar67 = uVar68 - 1 & uVar68;
        for (uVar61 = uVar68; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        }
        if (uVar67 != 0) {
          for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar9 = (int)pGVar65[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar5 = (ray->super_RayK<1>).org.field_0;
      auVar79 = vsubps_avx(local_4c0,(undefined1  [16])aVar5);
      uVar136 = auVar79._0_4_;
      auVar150._4_4_ = uVar136;
      auVar150._0_4_ = uVar136;
      auVar150._8_4_ = uVar136;
      auVar150._12_4_ = uVar136;
      auVar74 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      aVar6 = (pre->ray_space).vx.field_0;
      aVar7 = (pre->ray_space).vy.field_0;
      fVar161 = (pre->ray_space).vz.field_0.m128[0];
      fVar146 = (pre->ray_space).vz.field_0.m128[1];
      fVar147 = (pre->ray_space).vz.field_0.m128[2];
      fVar70 = (pre->ray_space).vz.field_0.m128[3];
      auVar194._0_4_ = auVar79._0_4_ * fVar161;
      auVar194._4_4_ = auVar79._4_4_ * fVar146;
      auVar194._8_4_ = auVar79._8_4_ * fVar147;
      auVar194._12_4_ = auVar79._12_4_ * fVar70;
      auVar74 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar7,auVar74);
      auVar18 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar6,auVar150);
      auVar74 = vshufps_avx(local_4c0,local_4c0,0xff);
      auVar17 = vsubps_avx(local_4d0,(undefined1  [16])aVar5);
      uVar136 = auVar17._0_4_;
      auVar154._4_4_ = uVar136;
      auVar154._0_4_ = uVar136;
      auVar154._8_4_ = uVar136;
      auVar154._12_4_ = uVar136;
      auVar79 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar195._0_4_ = auVar17._0_4_ * fVar161;
      auVar195._4_4_ = auVar17._4_4_ * fVar146;
      auVar195._8_4_ = auVar17._8_4_ * fVar147;
      auVar195._12_4_ = auVar17._12_4_ * fVar70;
      auVar79 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar7,auVar79);
      auVar19 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar6,auVar154);
      auVar79 = vshufps_avx(local_4d0,local_4d0,0xff);
      auVar77 = vsubps_avx512vl(auVar76,(undefined1  [16])aVar5);
      uVar136 = auVar77._0_4_;
      auVar190._4_4_ = uVar136;
      auVar190._0_4_ = uVar136;
      auVar190._8_4_ = uVar136;
      auVar190._12_4_ = uVar136;
      auVar17 = vshufps_avx(auVar77,auVar77,0x55);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar199._0_4_ = auVar77._0_4_ * fVar161;
      auVar199._4_4_ = auVar77._4_4_ * fVar146;
      auVar199._8_4_ = auVar77._8_4_ * fVar147;
      auVar199._12_4_ = auVar77._12_4_ * fVar70;
      auVar17 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar7,auVar17);
      auVar20 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar6,auVar190);
      auVar78 = vshufps_avx512vl(auVar76,auVar76,0xff);
      auVar56._12_4_ = fStack_524;
      auVar56._0_12_ = *pauVar4;
      local_3e0 = ZEXT1632((undefined1  [16])aVar5);
      auVar77 = vsubps_avx512vl(auVar56,(undefined1  [16])aVar5);
      uVar136 = auVar77._0_4_;
      auVar191._4_4_ = uVar136;
      auVar191._0_4_ = uVar136;
      auVar191._8_4_ = uVar136;
      auVar191._12_4_ = uVar136;
      auVar17 = vshufps_avx(auVar77,auVar77,0x55);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar202._0_4_ = auVar77._0_4_ * fVar161;
      auVar202._4_4_ = auVar77._4_4_ * fVar146;
      auVar202._8_4_ = auVar77._8_4_ * fVar147;
      auVar202._12_4_ = auVar77._12_4_ * fVar70;
      auVar17 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar7,auVar17);
      auVar17 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar6,auVar191);
      lVar25 = (long)iVar9 * 0x44;
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25);
      uVar136 = auVar18._0_4_;
      local_2e0._4_4_ = uVar136;
      local_2e0._0_4_ = uVar136;
      local_2e0._8_4_ = uVar136;
      local_2e0._12_4_ = uVar136;
      local_2e0._16_4_ = uVar136;
      local_2e0._20_4_ = uVar136;
      local_2e0._24_4_ = uVar136;
      local_2e0._28_4_ = uVar136;
      auVar82._8_4_ = 1;
      auVar82._0_8_ = 0x100000001;
      auVar82._12_4_ = 1;
      auVar82._16_4_ = 1;
      auVar82._20_4_ = 1;
      auVar82._24_4_ = 1;
      auVar82._28_4_ = 1;
      local_300 = vpermps_avx512vl(auVar82,ZEXT1632(auVar18));
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x484);
      local_320 = vbroadcastss_avx512vl(auVar19);
      local_340 = vpermps_avx512vl(auVar82,ZEXT1632(auVar19));
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar20);
      local_380 = vpermps_avx512vl(auVar82,ZEXT1632(auVar20));
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0xd8c);
      fVar146 = auVar17._0_4_;
      local_3a0._4_4_ = fVar146;
      local_3a0._0_4_ = fVar146;
      fStack_398 = fVar146;
      fStack_394 = fVar146;
      fStack_390 = fVar146;
      fStack_38c = fVar146;
      fStack_388 = fVar146;
      register0x0000139c = fVar146;
      _local_3c0 = vpermps_avx512vl(auVar82,ZEXT1632(auVar17));
      auVar82 = vmulps_avx512vl(_local_3a0,auVar97);
      auVar83 = vmulps_avx512vl(_local_3c0,auVar97);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar98,local_360);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar98,local_380);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar101,local_320);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar101,local_340);
      auVar84 = vfmadd231ps_avx512vl(auVar82,auVar96,local_2e0);
      auVar186 = ZEXT3264(auVar84);
      auVar85 = vfmadd231ps_avx512vl(auVar83,auVar96,local_300);
      auVar180 = ZEXT3264(auVar85);
      auVar82 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25);
      auVar83 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x484);
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x908);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0xd8c);
      auVar86 = vmulps_avx512vl(_local_3a0,auVar100);
      auVar87 = vmulps_avx512vl(_local_3c0,auVar100);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar99,local_360);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar99,local_380);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar83,local_320);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar83,local_340);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,local_2e0);
      auVar193 = ZEXT3264(auVar86);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar82,local_300);
      auVar88 = vsubps_avx512vl(auVar86,auVar84);
      auVar89 = vsubps_avx512vl(auVar87,auVar85);
      auVar90 = vmulps_avx512vl(auVar85,auVar88);
      auVar91 = vmulps_avx512vl(auVar84,auVar89);
      auVar90 = vsubps_avx512vl(auVar90,auVar91);
      auVar77 = vshufps_avx512vl(auVar56,auVar56,0xff);
      local_80 = vbroadcastsd_avx512vl(auVar74);
      local_a0 = vbroadcastsd_avx512vl(auVar79);
      local_c0 = vbroadcastsd_avx512vl(auVar78);
      local_e0 = vbroadcastsd_avx512vl(auVar77);
      auVar91 = vmulps_avx512vl(local_e0,auVar97);
      auVar74 = vfmadd231ps_fma(auVar91,auVar98,local_c0);
      auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar101,local_a0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_80);
      auVar92 = vmulps_avx512vl(local_e0,auVar100);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_c0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar83,local_a0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar82,local_80);
      auVar93 = vmulps_avx512vl(auVar89,auVar89);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar88);
      auVar94 = vmaxps_avx512vl(auVar91,auVar92);
      auVar94 = vmulps_avx512vl(auVar94,auVar94);
      auVar93 = vmulps_avx512vl(auVar94,auVar93);
      auVar90 = vmulps_avx512vl(auVar90,auVar90);
      uVar21 = vcmpps_avx512vl(auVar90,auVar93,2);
      auVar74 = vblendps_avx(auVar18,local_4c0,8);
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar77 = vandps_avx512vl(auVar74,auVar79);
      auVar74 = vblendps_avx(auVar19,local_4d0,8);
      auVar74 = vandps_avx512vl(auVar74,auVar79);
      auVar74 = vmaxps_avx(auVar77,auVar74);
      auVar76 = vblendps_avx(auVar20,auVar76,8);
      auVar77 = vandps_avx512vl(auVar76,auVar79);
      auVar76 = vblendps_avx(auVar17,auVar56,8);
      auVar76 = vandps_avx512vl(auVar76,auVar79);
      auVar76 = vmaxps_avx(auVar77,auVar76);
      auVar76 = vmaxps_avx(auVar74,auVar76);
      auVar74 = vmovshdup_avx(auVar76);
      auVar74 = vmaxss_avx(auVar74,auVar76);
      auVar76 = vshufpd_avx(auVar76,auVar76,1);
      auVar76 = vmaxss_avx(auVar76,auVar74);
      auVar90._0_4_ = (float)iVar9;
      local_440._4_12_ = auVar18._4_12_;
      local_440._0_4_ = auVar90._0_4_;
      local_440._16_16_ = auVar95._16_16_;
      auVar90._4_4_ = auVar90._0_4_;
      auVar90._8_4_ = auVar90._0_4_;
      auVar90._12_4_ = auVar90._0_4_;
      auVar90._16_4_ = auVar90._0_4_;
      auVar90._20_4_ = auVar90._0_4_;
      auVar90._24_4_ = auVar90._0_4_;
      auVar90._28_4_ = auVar90._0_4_;
      uVar22 = vcmpps_avx512vl(auVar90,_DAT_01faff40,0xe);
      bVar69 = (byte)uVar21 & (byte)uVar22;
      fVar161 = auVar76._0_4_ * 4.7683716e-07;
      local_420._0_16_ = ZEXT416((uint)fVar161);
      auVar95._8_4_ = 2;
      auVar95._0_8_ = 0x200000002;
      auVar95._12_4_ = 2;
      auVar95._16_4_ = 2;
      auVar95._20_4_ = 2;
      auVar95._24_4_ = 2;
      auVar95._28_4_ = 2;
      local_480 = vpermps_avx512vl(auVar95,ZEXT1632(auVar18));
      auVar210 = ZEXT3264(local_480);
      local_140 = vpermps_avx2(auVar95,ZEXT1632(auVar19));
      local_160 = vpermps_avx2(auVar95,ZEXT1632(auVar20));
      local_180 = vpermps_avx2(auVar95,ZEXT1632(auVar17));
      if (bVar69 != 0) {
        auVar95 = vmulps_avx512vl(local_180,auVar100);
        auVar95 = vfmadd213ps_avx512vl(auVar99,local_160,auVar95);
        auVar95 = vfmadd213ps_avx512vl(auVar83,local_140,auVar95);
        auVar82 = vfmadd213ps_avx512vl(auVar82,local_480,auVar95);
        auVar95 = vmulps_avx512vl(local_180,auVar97);
        auVar95 = vfmadd213ps_avx512vl(auVar98,local_160,auVar95);
        auVar83 = vfmadd213ps_avx512vl(auVar101,local_140,auVar95);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1210);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1694);
        auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1b18);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1f9c);
        auVar93 = vfmadd213ps_avx512vl(auVar96,local_480,auVar83);
        auVar196._0_4_ = fVar146 * auVar97._0_4_;
        auVar196._4_4_ = fVar146 * auVar97._4_4_;
        auVar196._8_4_ = fVar146 * auVar97._8_4_;
        auVar196._12_4_ = fVar146 * auVar97._12_4_;
        auVar196._16_4_ = fVar146 * auVar97._16_4_;
        auVar196._20_4_ = fVar146 * auVar97._20_4_;
        auVar196._24_4_ = fVar146 * auVar97._24_4_;
        auVar196._28_4_ = 0;
        auVar96 = vmulps_avx512vl(_local_3c0,auVar97);
        auVar97 = vmulps_avx512vl(local_180,auVar97);
        auVar83 = vfmadd231ps_avx512vl(auVar196,auVar98,local_360);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,local_380);
        auVar98 = vfmadd231ps_avx512vl(auVar97,local_160,auVar98);
        auVar97 = vfmadd231ps_avx512vl(auVar83,auVar101,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_340);
        auVar83 = vfmadd231ps_avx512vl(auVar98,local_140,auVar101);
        auVar76 = vfmadd231ps_fma(auVar97,auVar95,local_2e0);
        auVar99 = vfmadd231ps_avx512vl(auVar96,auVar95,local_300);
        auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1210);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1b18);
        auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1f9c);
        auVar83 = vfmadd231ps_avx512vl(auVar83,local_480,auVar95);
        auVar97._4_4_ = fVar146 * auVar98._4_4_;
        auVar97._0_4_ = fVar146 * auVar98._0_4_;
        auVar97._8_4_ = fVar146 * auVar98._8_4_;
        auVar97._12_4_ = fVar146 * auVar98._12_4_;
        auVar97._16_4_ = fVar146 * auVar98._16_4_;
        auVar97._20_4_ = fVar146 * auVar98._20_4_;
        auVar97._24_4_ = fVar146 * auVar98._24_4_;
        auVar97._28_4_ = auVar95._28_4_;
        auVar95 = vmulps_avx512vl(_local_3c0,auVar98);
        auVar210 = ZEXT3264(local_480);
        auVar98 = vmulps_avx512vl(local_180,auVar98);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,local_360);
        auVar100 = vfmadd231ps_avx512vl(auVar95,auVar101,local_380);
        auVar101 = vfmadd231ps_avx512vl(auVar98,local_160,auVar101);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1694);
        auVar98 = vfmadd231ps_avx512vl(auVar97,auVar95,local_320);
        auVar97 = vfmadd231ps_avx512vl(auVar100,auVar95,local_340);
        auVar95 = vfmadd231ps_avx512vl(auVar101,local_140,auVar95);
        auVar74 = vfmadd231ps_fma(auVar98,auVar96,local_2e0);
        auVar101 = vfmadd231ps_avx512vl(auVar97,auVar96,local_300);
        auVar98 = vfmadd231ps_avx512vl(auVar95,local_480,auVar96);
        auVar208._8_4_ = 0x7fffffff;
        auVar208._0_8_ = 0x7fffffff7fffffff;
        auVar208._12_4_ = 0x7fffffff;
        auVar208._16_4_ = 0x7fffffff;
        auVar208._20_4_ = 0x7fffffff;
        auVar208._24_4_ = 0x7fffffff;
        auVar208._28_4_ = 0x7fffffff;
        auVar95 = vandps_avx(ZEXT1632(auVar76),auVar208);
        auVar96 = vandps_avx(auVar99,auVar208);
        auVar96 = vmaxps_avx(auVar95,auVar96);
        auVar95 = vandps_avx(auVar83,auVar208);
        auVar95 = vmaxps_avx(auVar96,auVar95);
        auVar203._4_4_ = fVar161;
        auVar203._0_4_ = fVar161;
        auVar203._8_4_ = fVar161;
        auVar203._12_4_ = fVar161;
        auVar203._16_4_ = fVar161;
        auVar203._20_4_ = fVar161;
        auVar203._24_4_ = fVar161;
        auVar203._28_4_ = fVar161;
        uVar61 = vcmpps_avx512vl(auVar95,auVar203,1);
        bVar11 = (bool)((byte)uVar61 & 1);
        auVar94._0_4_ = (float)((uint)bVar11 * auVar88._0_4_ | (uint)!bVar11 * auVar76._0_4_);
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar94._4_4_ = (float)((uint)bVar11 * auVar88._4_4_ | (uint)!bVar11 * auVar76._4_4_);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar94._8_4_ = (float)((uint)bVar11 * auVar88._8_4_ | (uint)!bVar11 * auVar76._8_4_);
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar94._12_4_ = (float)((uint)bVar11 * auVar88._12_4_ | (uint)!bVar11 * auVar76._12_4_);
        fVar161 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar88._16_4_);
        auVar94._16_4_ = fVar161;
        fVar147 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar88._20_4_);
        auVar94._20_4_ = fVar147;
        fVar146 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar88._24_4_);
        auVar94._24_4_ = fVar146;
        uVar62 = (uint)(byte)(uVar61 >> 7) * auVar88._28_4_;
        auVar94._28_4_ = uVar62;
        bVar11 = (bool)((byte)uVar61 & 1);
        auVar102._0_4_ = (float)((uint)bVar11 * auVar89._0_4_ | (uint)!bVar11 * auVar99._0_4_);
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * auVar99._4_4_);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * auVar99._8_4_);
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * auVar99._12_4_);
        bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar11 * auVar89._16_4_ | (uint)!bVar11 * auVar99._16_4_);
        bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar11 * auVar89._20_4_ | (uint)!bVar11 * auVar99._20_4_);
        bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar11 * auVar89._24_4_ | (uint)!bVar11 * auVar99._24_4_);
        bVar11 = SUB81(uVar61 >> 7,0);
        auVar102._28_4_ = (uint)bVar11 * auVar89._28_4_ | (uint)!bVar11 * auVar99._28_4_;
        auVar95 = vandps_avx(auVar208,ZEXT1632(auVar74));
        auVar96 = vandps_avx(auVar101,auVar208);
        auVar96 = vmaxps_avx(auVar95,auVar96);
        auVar95 = vandps_avx(auVar98,auVar208);
        auVar95 = vmaxps_avx(auVar96,auVar95);
        uVar61 = vcmpps_avx512vl(auVar95,auVar203,1);
        bVar11 = (bool)((byte)uVar61 & 1);
        auVar103._0_4_ = (float)((uint)bVar11 * auVar88._0_4_ | (uint)!bVar11 * auVar74._0_4_);
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar11 * auVar88._4_4_ | (uint)!bVar11 * auVar74._4_4_);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar11 * auVar88._8_4_ | (uint)!bVar11 * auVar74._8_4_);
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar11 * auVar88._12_4_ | (uint)!bVar11 * auVar74._12_4_);
        fVar124 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar88._16_4_);
        auVar103._16_4_ = fVar124;
        fVar71 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar88._20_4_);
        auVar103._20_4_ = fVar71;
        fVar70 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar88._24_4_);
        auVar103._24_4_ = fVar70;
        auVar103._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar88._28_4_;
        bVar11 = (bool)((byte)uVar61 & 1);
        auVar104._0_4_ = (float)((uint)bVar11 * auVar89._0_4_ | (uint)!bVar11 * auVar101._0_4_);
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * auVar101._4_4_);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * auVar101._8_4_);
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * auVar101._12_4_);
        bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar11 * auVar89._16_4_ | (uint)!bVar11 * auVar101._16_4_);
        bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar11 * auVar89._20_4_ | (uint)!bVar11 * auVar101._20_4_);
        bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar11 * auVar89._24_4_ | (uint)!bVar11 * auVar101._24_4_);
        bVar11 = SUB81(uVar61 >> 7,0);
        auVar104._28_4_ = (uint)bVar11 * auVar89._28_4_ | (uint)!bVar11 * auVar101._28_4_;
        auVar80 = vxorps_avx512vl(local_320._0_16_,local_320._0_16_);
        auVar95 = vfmadd213ps_avx512vl(auVar94,auVar94,ZEXT1632(auVar80));
        auVar76 = vfmadd231ps_fma(auVar95,auVar102,auVar102);
        auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
        fVar125 = auVar95._0_4_;
        fVar128 = auVar95._4_4_;
        fVar129 = auVar95._8_4_;
        fVar132 = auVar95._12_4_;
        fVar133 = auVar95._16_4_;
        fVar126 = auVar95._20_4_;
        fVar127 = auVar95._24_4_;
        auVar96._4_4_ = fVar128 * fVar128 * fVar128 * auVar76._4_4_ * -0.5;
        auVar96._0_4_ = fVar125 * fVar125 * fVar125 * auVar76._0_4_ * -0.5;
        auVar96._8_4_ = fVar129 * fVar129 * fVar129 * auVar76._8_4_ * -0.5;
        auVar96._12_4_ = fVar132 * fVar132 * fVar132 * auVar76._12_4_ * -0.5;
        auVar96._16_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar96._20_4_ = fVar126 * fVar126 * fVar126 * -0.0;
        auVar96._24_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar96._28_4_ = 0;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar97,auVar95);
        auVar101._4_4_ = auVar102._4_4_ * auVar96._4_4_;
        auVar101._0_4_ = auVar102._0_4_ * auVar96._0_4_;
        auVar101._8_4_ = auVar102._8_4_ * auVar96._8_4_;
        auVar101._12_4_ = auVar102._12_4_ * auVar96._12_4_;
        auVar101._16_4_ = auVar102._16_4_ * auVar96._16_4_;
        auVar101._20_4_ = auVar102._20_4_ * auVar96._20_4_;
        auVar101._24_4_ = auVar102._24_4_ * auVar96._24_4_;
        auVar101._28_4_ = auVar95._28_4_;
        auVar98._4_4_ = auVar96._4_4_ * -auVar94._4_4_;
        auVar98._0_4_ = auVar96._0_4_ * -auVar94._0_4_;
        auVar98._8_4_ = auVar96._8_4_ * -auVar94._8_4_;
        auVar98._12_4_ = auVar96._12_4_ * -auVar94._12_4_;
        auVar98._16_4_ = auVar96._16_4_ * -fVar161;
        auVar98._20_4_ = auVar96._20_4_ * -fVar147;
        auVar98._24_4_ = auVar96._24_4_ * -fVar146;
        auVar98._28_4_ = uVar62 ^ 0x80000000;
        auVar95 = vmulps_avx512vl(auVar96,ZEXT1632(auVar80));
        auVar88 = ZEXT1632(auVar80);
        auVar83 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar88);
        auVar76 = vfmadd231ps_fma(auVar83,auVar104,auVar104);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
        fVar161 = auVar100._0_4_;
        fVar146 = auVar100._4_4_;
        fVar147 = auVar100._8_4_;
        fVar125 = auVar100._12_4_;
        fVar128 = auVar100._16_4_;
        fVar129 = auVar100._20_4_;
        fVar132 = auVar100._24_4_;
        auVar83._4_4_ = fVar146 * fVar146 * fVar146 * auVar76._4_4_ * -0.5;
        auVar83._0_4_ = fVar161 * fVar161 * fVar161 * auVar76._0_4_ * -0.5;
        auVar83._8_4_ = fVar147 * fVar147 * fVar147 * auVar76._8_4_ * -0.5;
        auVar83._12_4_ = fVar125 * fVar125 * fVar125 * auVar76._12_4_ * -0.5;
        auVar83._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar83._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar83._24_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar83._28_4_ = 0;
        auVar97 = vfmadd231ps_avx512vl(auVar83,auVar97,auVar100);
        auVar99._4_4_ = auVar104._4_4_ * auVar97._4_4_;
        auVar99._0_4_ = auVar104._0_4_ * auVar97._0_4_;
        auVar99._8_4_ = auVar104._8_4_ * auVar97._8_4_;
        auVar99._12_4_ = auVar104._12_4_ * auVar97._12_4_;
        auVar99._16_4_ = auVar104._16_4_ * auVar97._16_4_;
        auVar99._20_4_ = auVar104._20_4_ * auVar97._20_4_;
        auVar99._24_4_ = auVar104._24_4_ * auVar97._24_4_;
        auVar99._28_4_ = auVar100._28_4_;
        auVar100._4_4_ = -auVar103._4_4_ * auVar97._4_4_;
        auVar100._0_4_ = -auVar103._0_4_ * auVar97._0_4_;
        auVar100._8_4_ = -auVar103._8_4_ * auVar97._8_4_;
        auVar100._12_4_ = -auVar103._12_4_ * auVar97._12_4_;
        auVar100._16_4_ = -fVar124 * auVar97._16_4_;
        auVar100._20_4_ = -fVar71 * auVar97._20_4_;
        auVar100._24_4_ = -fVar70 * auVar97._24_4_;
        auVar100._28_4_ = auVar96._28_4_;
        auVar96 = vmulps_avx512vl(auVar97,auVar88);
        auVar76 = vfmadd213ps_fma(auVar101,auVar91,auVar84);
        auVar74 = vfmadd213ps_fma(auVar98,auVar91,auVar85);
        auVar97 = vfmadd213ps_avx512vl(auVar95,auVar91,auVar93);
        auVar83 = vfmadd213ps_avx512vl(auVar99,auVar92,auVar86);
        auVar18 = vfnmadd213ps_fma(auVar101,auVar91,auVar84);
        auVar79 = vfmadd213ps_fma(auVar100,auVar92,auVar87);
        auVar19 = vfnmadd213ps_fma(auVar98,auVar91,auVar85);
        auVar101 = vfmadd213ps_avx512vl(auVar96,auVar92,auVar82);
        auVar98 = vfnmadd231ps_avx512vl(auVar93,auVar91,auVar95);
        auVar20 = vfnmadd213ps_fma(auVar99,auVar92,auVar86);
        auVar78 = vfnmadd213ps_fma(auVar100,auVar92,auVar87);
        auVar96 = vfnmadd231ps_avx512vl(auVar82,auVar92,auVar96);
        auVar82 = vsubps_avx512vl(auVar83,ZEXT1632(auVar18));
        auVar95 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar19));
        auVar99 = vsubps_avx512vl(auVar101,auVar98);
        auVar100 = vmulps_avx512vl(auVar95,auVar98);
        auVar17 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar19),auVar99);
        auVar84._4_4_ = auVar18._4_4_ * auVar99._4_4_;
        auVar84._0_4_ = auVar18._0_4_ * auVar99._0_4_;
        auVar84._8_4_ = auVar18._8_4_ * auVar99._8_4_;
        auVar84._12_4_ = auVar18._12_4_ * auVar99._12_4_;
        auVar84._16_4_ = auVar99._16_4_ * 0.0;
        auVar84._20_4_ = auVar99._20_4_ * 0.0;
        auVar84._24_4_ = auVar99._24_4_ * 0.0;
        auVar84._28_4_ = auVar99._28_4_;
        auVar99 = vfmsub231ps_avx512vl(auVar84,auVar98,auVar82);
        auVar85._4_4_ = auVar19._4_4_ * auVar82._4_4_;
        auVar85._0_4_ = auVar19._0_4_ * auVar82._0_4_;
        auVar85._8_4_ = auVar19._8_4_ * auVar82._8_4_;
        auVar85._12_4_ = auVar19._12_4_ * auVar82._12_4_;
        auVar85._16_4_ = auVar82._16_4_ * 0.0;
        auVar85._20_4_ = auVar82._20_4_ * 0.0;
        auVar85._24_4_ = auVar82._24_4_ * 0.0;
        auVar85._28_4_ = auVar82._28_4_;
        auVar77 = vfmsub231ps_fma(auVar85,ZEXT1632(auVar18),auVar95);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar88,auVar99);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar88,ZEXT1632(auVar17));
        auVar94 = ZEXT1632(auVar80);
        uVar61 = vcmpps_avx512vl(auVar95,auVar94,2);
        bVar60 = (byte)uVar61;
        fVar70 = (float)((uint)(bVar60 & 1) * auVar76._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar20._0_4_);
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        fVar124 = (float)((uint)bVar11 * auVar76._4_4_ | (uint)!bVar11 * auVar20._4_4_);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        fVar128 = (float)((uint)bVar11 * auVar76._8_4_ | (uint)!bVar11 * auVar20._8_4_);
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        fVar132 = (float)((uint)bVar11 * auVar76._12_4_ | (uint)!bVar11 * auVar20._12_4_);
        auVar82 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar128,CONCAT44(fVar124,fVar70))));
        fVar71 = (float)((uint)(bVar60 & 1) * auVar74._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar78._0_4_);
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        fVar125 = (float)((uint)bVar11 * auVar74._4_4_ | (uint)!bVar11 * auVar78._4_4_);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        fVar129 = (float)((uint)bVar11 * auVar74._8_4_ | (uint)!bVar11 * auVar78._8_4_);
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        fVar133 = (float)((uint)bVar11 * auVar74._12_4_ | (uint)!bVar11 * auVar78._12_4_);
        auVar99 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar129,CONCAT44(fVar125,fVar71))));
        auVar89._0_4_ =
             (uint)(bVar60 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar96._0_4_;
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar89._4_4_ = (uint)bVar11 * auVar97._4_4_ | (uint)!bVar11 * auVar96._4_4_;
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar89._8_4_ = (uint)bVar11 * auVar97._8_4_ | (uint)!bVar11 * auVar96._8_4_;
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar89._12_4_ = (uint)bVar11 * auVar97._12_4_ | (uint)!bVar11 * auVar96._12_4_;
        bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar89._16_4_ = (uint)bVar11 * auVar97._16_4_ | (uint)!bVar11 * auVar96._16_4_;
        bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar89._20_4_ = (uint)bVar11 * auVar97._20_4_ | (uint)!bVar11 * auVar96._20_4_;
        bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar89._24_4_ = (uint)bVar11 * auVar97._24_4_ | (uint)!bVar11 * auVar96._24_4_;
        bVar11 = SUB81(uVar61 >> 7,0);
        auVar89._28_4_ = (uint)bVar11 * auVar97._28_4_ | (uint)!bVar11 * auVar96._28_4_;
        auVar96 = vblendmps_avx512vl(ZEXT1632(auVar18),auVar83);
        auVar93._0_4_ =
             (uint)(bVar60 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar17._0_4_;
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar93._4_4_ = (uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * auVar17._4_4_;
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar93._8_4_ = (uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * auVar17._8_4_;
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar93._12_4_ = (uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * auVar17._12_4_;
        auVar93._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * auVar96._16_4_;
        auVar93._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * auVar96._20_4_;
        auVar93._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * auVar96._24_4_;
        auVar93._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar96._28_4_;
        auVar96 = vblendmps_avx512vl(ZEXT1632(auVar19),ZEXT1632(auVar79));
        auVar105._0_4_ =
             (float)((uint)(bVar60 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar74._0_4_)
        ;
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * auVar74._4_4_);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * auVar74._8_4_);
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * auVar74._12_4_);
        fVar161 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar96._16_4_);
        auVar105._16_4_ = fVar161;
        fVar147 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar96._20_4_);
        auVar105._20_4_ = fVar147;
        fVar146 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar96._24_4_);
        auVar105._24_4_ = fVar146;
        auVar105._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar96._28_4_;
        auVar96 = vblendmps_avx512vl(auVar98,auVar101);
        auVar106._0_4_ =
             (float)((uint)(bVar60 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar97._0_4_)
        ;
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar11 * auVar96._4_4_ | (uint)!bVar11 * auVar97._4_4_);
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar11 * auVar96._8_4_ | (uint)!bVar11 * auVar97._8_4_);
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar11 * auVar96._12_4_ | (uint)!bVar11 * auVar97._12_4_);
        bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar11 * auVar96._16_4_ | (uint)!bVar11 * auVar97._16_4_);
        bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar11 * auVar96._20_4_ | (uint)!bVar11 * auVar97._20_4_);
        bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar11 * auVar96._24_4_ | (uint)!bVar11 * auVar97._24_4_);
        bVar11 = SUB81(uVar61 >> 7,0);
        auVar106._28_4_ = (uint)bVar11 * auVar96._28_4_ | (uint)!bVar11 * auVar97._28_4_;
        auVar107._0_4_ =
             (uint)(bVar60 & 1) * (int)auVar18._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar83._0_4_;
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar11 * (int)auVar18._4_4_ | (uint)!bVar11 * auVar83._4_4_;
        bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar11 * (int)auVar18._8_4_ | (uint)!bVar11 * auVar83._8_4_;
        bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar11 * (int)auVar18._12_4_ | (uint)!bVar11 * auVar83._12_4_;
        auVar107._16_4_ = (uint)!(bool)((byte)(uVar61 >> 4) & 1) * auVar83._16_4_;
        auVar107._20_4_ = (uint)!(bool)((byte)(uVar61 >> 5) & 1) * auVar83._20_4_;
        auVar107._24_4_ = (uint)!(bool)((byte)(uVar61 >> 6) & 1) * auVar83._24_4_;
        auVar107._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar83._28_4_;
        bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar61 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar108._0_4_ =
             (uint)(bVar60 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar101._0_4_;
        bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar101._4_4_;
        bVar12 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar101._8_4_;
        bVar12 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar101._12_4_;
        bVar12 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar108._16_4_ = (uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar101._16_4_;
        bVar12 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar108._20_4_ = (uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar101._20_4_;
        bVar12 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar108._24_4_ = (uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar101._24_4_;
        bVar12 = SUB81(uVar61 >> 7,0);
        auVar108._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar101._28_4_;
        auVar97 = vsubps_avx512vl(auVar107,auVar82);
        auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar19._12_4_ |
                                                (uint)!bVar14 * auVar79._12_4_,
                                                CONCAT48((uint)bVar13 * (int)auVar19._8_4_ |
                                                         (uint)!bVar13 * auVar79._8_4_,
                                                         CONCAT44((uint)bVar11 * (int)auVar19._4_4_
                                                                  | (uint)!bVar11 * auVar79._4_4_,
                                                                  (uint)(bVar60 & 1) *
                                                                  (int)auVar19._0_4_ |
                                                                  (uint)!(bool)(bVar60 & 1) *
                                                                  auVar79._0_4_)))),auVar99);
        auVar186 = ZEXT3264(auVar96);
        auVar83 = vsubps_avx512vl(auVar108,auVar89);
        auVar101 = vsubps_avx(auVar82,auVar93);
        auVar193 = ZEXT3264(auVar101);
        auVar98 = vsubps_avx(auVar99,auVar105);
        auVar100 = vsubps_avx512vl(auVar89,auVar106);
        auVar86._4_4_ = auVar83._4_4_ * fVar124;
        auVar86._0_4_ = auVar83._0_4_ * fVar70;
        auVar86._8_4_ = auVar83._8_4_ * fVar128;
        auVar86._12_4_ = auVar83._12_4_ * fVar132;
        auVar86._16_4_ = auVar83._16_4_ * 0.0;
        auVar86._20_4_ = auVar83._20_4_ * 0.0;
        auVar86._24_4_ = auVar83._24_4_ * 0.0;
        auVar86._28_4_ = auVar108._28_4_;
        auVar84 = vfmsub231ps_avx512vl(auVar86,auVar89,auVar97);
        auVar87._4_4_ = fVar125 * auVar97._4_4_;
        auVar87._0_4_ = fVar71 * auVar97._0_4_;
        auVar87._8_4_ = fVar129 * auVar97._8_4_;
        auVar87._12_4_ = fVar133 * auVar97._12_4_;
        auVar87._16_4_ = auVar97._16_4_ * 0.0;
        auVar87._20_4_ = auVar97._20_4_ * 0.0;
        auVar87._24_4_ = auVar97._24_4_ * 0.0;
        auVar87._28_4_ = auVar95._28_4_;
        auVar76 = vfmsub231ps_fma(auVar87,auVar82,auVar96);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar94,auVar84);
        auVar84 = vmulps_avx512vl(auVar96,auVar89);
        auVar76 = vfmsub231ps_fma(auVar84,auVar99,auVar83);
        auVar84 = vfmadd231ps_avx512vl(auVar95,auVar94,ZEXT1632(auVar76));
        auVar95 = vmulps_avx512vl(auVar100,auVar93);
        auVar95 = vfmsub231ps_avx512vl(auVar95,auVar101,auVar106);
        auVar88._4_4_ = auVar98._4_4_ * auVar106._4_4_;
        auVar88._0_4_ = auVar98._0_4_ * auVar106._0_4_;
        auVar88._8_4_ = auVar98._8_4_ * auVar106._8_4_;
        auVar88._12_4_ = auVar98._12_4_ * auVar106._12_4_;
        auVar88._16_4_ = auVar98._16_4_ * auVar106._16_4_;
        auVar88._20_4_ = auVar98._20_4_ * auVar106._20_4_;
        auVar88._24_4_ = auVar98._24_4_ * auVar106._24_4_;
        auVar88._28_4_ = auVar106._28_4_;
        auVar76 = vfmsub231ps_fma(auVar88,auVar105,auVar100);
        auVar177._0_4_ = auVar105._0_4_ * auVar101._0_4_;
        auVar177._4_4_ = auVar105._4_4_ * auVar101._4_4_;
        auVar177._8_4_ = auVar105._8_4_ * auVar101._8_4_;
        auVar177._12_4_ = auVar105._12_4_ * auVar101._12_4_;
        auVar177._16_4_ = fVar161 * auVar101._16_4_;
        auVar177._20_4_ = fVar147 * auVar101._20_4_;
        auVar177._24_4_ = fVar146 * auVar101._24_4_;
        auVar177._28_4_ = 0;
        auVar74 = vfmsub231ps_fma(auVar177,auVar98,auVar93);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar94,auVar95);
        auVar85 = vfmadd231ps_avx512vl(auVar95,auVar94,ZEXT1632(auVar76));
        auVar180 = ZEXT3264(auVar85);
        auVar95 = vmaxps_avx(auVar84,auVar85);
        uVar21 = vcmpps_avx512vl(auVar95,auVar94,2);
        bVar69 = bVar69 & (byte)uVar21;
        if (bVar69 != 0) {
          auVar35._4_4_ = auVar100._4_4_ * auVar96._4_4_;
          auVar35._0_4_ = auVar100._0_4_ * auVar96._0_4_;
          auVar35._8_4_ = auVar100._8_4_ * auVar96._8_4_;
          auVar35._12_4_ = auVar100._12_4_ * auVar96._12_4_;
          auVar35._16_4_ = auVar100._16_4_ * auVar96._16_4_;
          auVar35._20_4_ = auVar100._20_4_ * auVar96._20_4_;
          auVar35._24_4_ = auVar100._24_4_ * auVar96._24_4_;
          auVar35._28_4_ = auVar95._28_4_;
          auVar17 = vfmsub231ps_fma(auVar35,auVar98,auVar83);
          auVar36._4_4_ = auVar83._4_4_ * auVar101._4_4_;
          auVar36._0_4_ = auVar83._0_4_ * auVar101._0_4_;
          auVar36._8_4_ = auVar83._8_4_ * auVar101._8_4_;
          auVar36._12_4_ = auVar83._12_4_ * auVar101._12_4_;
          auVar36._16_4_ = auVar83._16_4_ * auVar101._16_4_;
          auVar36._20_4_ = auVar83._20_4_ * auVar101._20_4_;
          auVar36._24_4_ = auVar83._24_4_ * auVar101._24_4_;
          auVar36._28_4_ = auVar83._28_4_;
          auVar79 = vfmsub231ps_fma(auVar36,auVar97,auVar100);
          auVar37._4_4_ = auVar98._4_4_ * auVar97._4_4_;
          auVar37._0_4_ = auVar98._0_4_ * auVar97._0_4_;
          auVar37._8_4_ = auVar98._8_4_ * auVar97._8_4_;
          auVar37._12_4_ = auVar98._12_4_ * auVar97._12_4_;
          auVar37._16_4_ = auVar98._16_4_ * auVar97._16_4_;
          auVar37._20_4_ = auVar98._20_4_ * auVar97._20_4_;
          auVar37._24_4_ = auVar98._24_4_ * auVar97._24_4_;
          auVar37._28_4_ = auVar98._28_4_;
          auVar77 = vfmsub231ps_fma(auVar37,auVar101,auVar96);
          auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar77));
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar76),ZEXT1632(auVar17),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar95 = vrcp14ps_avx512vl(ZEXT1632(auVar74));
          auVar193 = ZEXT3264(auVar95);
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = 0x3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar27._16_4_ = 0x3f800000;
          auVar27._20_4_ = 0x3f800000;
          auVar27._24_4_ = 0x3f800000;
          auVar27._28_4_ = 0x3f800000;
          auVar96 = vfnmadd213ps_avx512vl(auVar95,ZEXT1632(auVar74),auVar27);
          auVar76 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
          auVar186 = ZEXT1664(auVar76);
          auVar95 = vmulps_avx512vl(auVar89,ZEXT1632(auVar77));
          auVar79 = vfmadd231ps_fma(auVar95,auVar99,ZEXT1632(auVar79));
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar82,ZEXT1632(auVar17));
          fVar146 = auVar76._0_4_;
          fVar147 = auVar76._4_4_;
          fVar70 = auVar76._8_4_;
          fVar71 = auVar76._12_4_;
          local_280 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar71,
                                         CONCAT48(auVar79._8_4_ * fVar70,
                                                  CONCAT44(auVar79._4_4_ * fVar147,
                                                           auVar79._0_4_ * fVar146))));
          auVar206 = ZEXT3264(local_280);
          auVar139._8_4_ = 3;
          auVar139._0_8_ = 0x300000003;
          auVar139._12_4_ = 3;
          auVar139._16_4_ = 3;
          auVar139._20_4_ = 3;
          auVar139._24_4_ = 3;
          auVar139._28_4_ = 3;
          auVar95 = vpermps_avx2(auVar139,ZEXT1632((undefined1  [16])aVar5));
          uVar21 = vcmpps_avx512vl(auVar95,local_280,2);
          fVar161 = (ray->super_RayK<1>).tfar;
          auVar28._4_4_ = fVar161;
          auVar28._0_4_ = fVar161;
          auVar28._8_4_ = fVar161;
          auVar28._12_4_ = fVar161;
          auVar28._16_4_ = fVar161;
          auVar28._20_4_ = fVar161;
          auVar28._24_4_ = fVar161;
          auVar28._28_4_ = fVar161;
          uVar22 = vcmpps_avx512vl(local_280,auVar28,2);
          bVar69 = (byte)uVar21 & (byte)uVar22 & bVar69;
          if (bVar69 != 0) {
            uVar67 = vcmpps_avx512vl(ZEXT1632(auVar74),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar67 = bVar69 & uVar67;
            if ((char)uVar67 != '\0') {
              fVar161 = auVar84._0_4_ * fVar146;
              fVar124 = auVar84._4_4_ * fVar147;
              auVar38._4_4_ = fVar124;
              auVar38._0_4_ = fVar161;
              fVar125 = auVar84._8_4_ * fVar70;
              auVar38._8_4_ = fVar125;
              fVar128 = auVar84._12_4_ * fVar71;
              auVar38._12_4_ = fVar128;
              fVar129 = auVar84._16_4_ * 0.0;
              auVar38._16_4_ = fVar129;
              fVar132 = auVar84._20_4_ * 0.0;
              auVar38._20_4_ = fVar132;
              fVar133 = auVar84._24_4_ * 0.0;
              auVar38._24_4_ = fVar133;
              auVar38._28_4_ = auVar84._28_4_;
              auVar140._8_4_ = 0x3f800000;
              auVar140._0_8_ = 0x3f8000003f800000;
              auVar140._12_4_ = 0x3f800000;
              auVar140._16_4_ = 0x3f800000;
              auVar140._20_4_ = 0x3f800000;
              auVar140._24_4_ = 0x3f800000;
              auVar140._28_4_ = 0x3f800000;
              auVar95 = vsubps_avx(auVar140,auVar38);
              local_2c0._0_4_ =
                   (float)((uint)(bVar60 & 1) * (int)fVar161 |
                          (uint)!(bool)(bVar60 & 1) * auVar95._0_4_);
              bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
              local_2c0._4_4_ = (float)((uint)bVar11 * (int)fVar124 | (uint)!bVar11 * auVar95._4_4_)
              ;
              bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar11 * (int)fVar125 | (uint)!bVar11 * auVar95._8_4_)
              ;
              bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar11 * (int)fVar128 | (uint)!bVar11 * auVar95._12_4_);
              bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar11 * (int)fVar129 | (uint)!bVar11 * auVar95._16_4_);
              bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar11 * (int)fVar132 | (uint)!bVar11 * auVar95._20_4_);
              bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar11 * (int)fVar133 | (uint)!bVar11 * auVar95._24_4_);
              bVar11 = SUB81(uVar61 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar11 * auVar84._28_4_ | (uint)!bVar11 * auVar95._28_4_);
              auVar95 = vsubps_avx(auVar92,auVar91);
              auVar76 = vfmadd213ps_fma(auVar95,local_2c0,auVar91);
              fVar161 = pre->depth_scale;
              auVar91._4_4_ = fVar161;
              auVar91._0_4_ = fVar161;
              auVar91._8_4_ = fVar161;
              auVar91._12_4_ = fVar161;
              auVar91._16_4_ = fVar161;
              auVar91._20_4_ = fVar161;
              auVar91._24_4_ = fVar161;
              auVar91._28_4_ = fVar161;
              auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                           CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                                                    CONCAT44(auVar76._4_4_ +
                                                                             auVar76._4_4_,
                                                                             auVar76._0_4_ +
                                                                             auVar76._0_4_)))),
                                        auVar91);
              uVar23 = vcmpps_avx512vl(local_280,auVar95,6);
              uVar67 = uVar67 & uVar23;
              bVar69 = (byte)uVar67;
              if (bVar69 != 0) {
                auVar159._0_4_ = auVar85._0_4_ * fVar146;
                auVar159._4_4_ = auVar85._4_4_ * fVar147;
                auVar159._8_4_ = auVar85._8_4_ * fVar70;
                auVar159._12_4_ = auVar85._12_4_ * fVar71;
                auVar159._16_4_ = auVar85._16_4_ * 0.0;
                auVar159._20_4_ = auVar85._20_4_ * 0.0;
                auVar159._24_4_ = auVar85._24_4_ * 0.0;
                auVar159._28_4_ = 0;
                auVar172._8_4_ = 0x3f800000;
                auVar172._0_8_ = 0x3f8000003f800000;
                auVar172._12_4_ = 0x3f800000;
                auVar172._16_4_ = 0x3f800000;
                auVar172._20_4_ = 0x3f800000;
                auVar172._24_4_ = 0x3f800000;
                auVar172._28_4_ = 0x3f800000;
                auVar95 = vsubps_avx(auVar172,auVar159);
                auVar109._0_4_ =
                     (uint)(bVar60 & 1) * (int)auVar159._0_4_ |
                     (uint)!(bool)(bVar60 & 1) * auVar95._0_4_;
                bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
                auVar109._4_4_ = (uint)bVar11 * (int)auVar159._4_4_ | (uint)!bVar11 * auVar95._4_4_;
                bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
                auVar109._8_4_ = (uint)bVar11 * (int)auVar159._8_4_ | (uint)!bVar11 * auVar95._8_4_;
                bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
                auVar109._12_4_ =
                     (uint)bVar11 * (int)auVar159._12_4_ | (uint)!bVar11 * auVar95._12_4_;
                bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
                auVar109._16_4_ =
                     (uint)bVar11 * (int)auVar159._16_4_ | (uint)!bVar11 * auVar95._16_4_;
                bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
                auVar109._20_4_ =
                     (uint)bVar11 * (int)auVar159._20_4_ | (uint)!bVar11 * auVar95._20_4_;
                bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
                auVar109._24_4_ =
                     (uint)bVar11 * (int)auVar159._24_4_ | (uint)!bVar11 * auVar95._24_4_;
                auVar109._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar95._28_4_;
                auVar92._8_4_ = 0x40000000;
                auVar92._0_8_ = 0x4000000040000000;
                auVar92._12_4_ = 0x40000000;
                auVar92._16_4_ = 0x40000000;
                auVar92._20_4_ = 0x40000000;
                auVar92._24_4_ = 0x40000000;
                auVar92._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar109,auVar172,auVar92);
                local_260 = 0;
                local_25c = iVar9;
                auVar198 = ZEXT1664(local_4c0);
                local_250 = local_4c0;
                auVar200 = ZEXT1664(local_4d0);
                local_240 = local_4d0;
                local_230 = *(undefined8 *)*pauVar3;
                uStack_228 = *(undefined8 *)(*pauVar3 + 8);
                if ((pGVar65->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar161 = 1.0 / auVar90._0_4_;
                  local_200[0] = fVar161 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar161 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar161 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar161 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar161 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar161 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar161 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_280;
                  auVar141._8_4_ = 0x7f800000;
                  auVar141._0_8_ = 0x7f8000007f800000;
                  auVar141._12_4_ = 0x7f800000;
                  auVar141._16_4_ = 0x7f800000;
                  auVar141._20_4_ = 0x7f800000;
                  auVar141._24_4_ = 0x7f800000;
                  auVar141._28_4_ = 0x7f800000;
                  auVar95 = vblendmps_avx512vl(auVar141,local_280);
                  auVar110._0_4_ =
                       (uint)(bVar69 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
                  auVar110._4_4_ = (uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
                  auVar110._8_4_ = (uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
                  auVar110._12_4_ = (uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
                  auVar110._16_4_ = (uint)bVar11 * auVar95._16_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
                  auVar110._20_4_ = (uint)bVar11 * auVar95._20_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
                  auVar110._24_4_ = (uint)bVar11 * auVar95._24_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = SUB81(uVar67 >> 7,0);
                  auVar110._28_4_ = (uint)bVar11 * auVar95._28_4_ | (uint)!bVar11 * 0x7f800000;
                  auVar95 = vshufps_avx(auVar110,auVar110,0xb1);
                  auVar95 = vminps_avx(auVar110,auVar95);
                  auVar96 = vshufpd_avx(auVar95,auVar95,5);
                  auVar95 = vminps_avx(auVar95,auVar96);
                  auVar96 = vpermpd_avx2(auVar95,0x4e);
                  auVar95 = vminps_avx(auVar95,auVar96);
                  uVar21 = vcmpps_avx512vl(auVar110,auVar95,0);
                  uVar62 = (uint)uVar67;
                  if (((byte)uVar21 & bVar69) != 0) {
                    uVar62 = (uint)((byte)uVar21 & bVar69);
                  }
                  uVar24 = 0;
                  for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
                    uVar24 = uVar24 + 1;
                  }
                  uVar61 = (ulong)uVar24;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar65->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    local_460 = local_280;
                    do {
                      local_4a4 = local_200[uVar61];
                      local_4a0 = *(undefined4 *)(local_1e0 + uVar61 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar61 * 4);
                      local_500.context = context->user;
                      fVar161 = 1.0 - local_4a4;
                      auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(local_4a4 * (fVar161 + fVar161))),
                                                 ZEXT416((uint)fVar161),ZEXT416((uint)fVar161));
                      auVar74 = ZEXT416((uint)local_4a4);
                      auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar74,
                                                ZEXT416(0xc0a00000));
                      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4 * 3.0)),
                                                ZEXT416((uint)(local_4a4 + local_4a4)),auVar76);
                      auVar193 = ZEXT1664(auVar79);
                      auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar74,
                                                ZEXT416(0x40000000));
                      auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161 * -3.0)),
                                                ZEXT416((uint)(fVar161 + fVar161)),auVar76);
                      auVar74 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4)),auVar74,
                                                ZEXT416((uint)(fVar161 * -2.0)));
                      fVar161 = auVar17._0_4_ * 0.5;
                      fVar146 = auVar79._0_4_ * 0.5;
                      auVar180 = ZEXT464((uint)fVar146);
                      fVar147 = auVar76._0_4_ * 0.5;
                      fVar70 = auVar74._0_4_ * 0.5;
                      auVar170._0_4_ = fVar70 * local_530;
                      auVar170._4_4_ = fVar70 * fStack_52c;
                      auVar170._8_4_ = fVar70 * fStack_528;
                      auVar170._12_4_ = fVar70 * fStack_524;
                      auVar185._4_4_ = fVar147;
                      auVar185._0_4_ = fVar147;
                      auVar185._8_4_ = fVar147;
                      auVar185._12_4_ = fVar147;
                      auVar59._8_8_ = uStack_518;
                      auVar59._0_8_ = local_520;
                      auVar76 = vfmadd132ps_fma(auVar185,auVar170,auVar59);
                      auVar186 = ZEXT1664(auVar76);
                      auVar171._4_4_ = fVar146;
                      auVar171._0_4_ = fVar146;
                      auVar171._8_4_ = fVar146;
                      auVar171._12_4_ = fVar146;
                      auVar74 = vfmadd213ps_fma(auVar171,auVar200._0_16_,auVar76);
                      auVar158._4_4_ = fVar161;
                      auVar158._0_4_ = fVar161;
                      auVar158._8_4_ = fVar161;
                      auVar158._12_4_ = fVar161;
                      auVar74 = vfmadd213ps_fma(auVar158,auVar198._0_16_,auVar74);
                      local_4b0 = vmovlps_avx(auVar74);
                      local_4a8 = vextractps_avx(auVar74,2);
                      local_49c = (int)local_538;
                      local_498 = (int)local_550;
                      local_494 = (local_500.context)->instID[0];
                      local_490 = (local_500.context)->instPrimID[0];
                      local_554 = -1;
                      local_500.valid = &local_554;
                      local_500.geometryUserPtr = pGVar65->userPtr;
                      local_500.ray = (RTCRayN *)ray;
                      local_500.hit = (RTCHitN *)&local_4b0;
                      local_500.N = 1;
                      if (pGVar65->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ace770:
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar65->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar180 = ZEXT1664(auVar180._0_16_);
                          auVar186 = ZEXT1664(auVar186._0_16_);
                          auVar193 = ZEXT1664(auVar193._0_16_);
                          (*p_Var10)(&local_500);
                          auVar206 = ZEXT3264(local_460);
                          auVar210 = ZEXT3264(local_480);
                          auVar200 = ZEXT1664(local_4d0);
                          auVar198 = ZEXT1664(local_4c0);
                          ray = local_540;
                          context = local_548;
                          if (*local_500.valid == 0) goto LAB_01ace821;
                        }
                        (((Vec3f *)((long)local_500.ray + 0x30))->field_0).components[0] =
                             *(float *)local_500.hit;
                        (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_500.hit + 4);
                        (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_500.hit + 8);
                        *(float *)((long)local_500.ray + 0x3c) = *(float *)(local_500.hit + 0xc);
                        *(float *)((long)local_500.ray + 0x40) = *(float *)(local_500.hit + 0x10);
                        *(float *)((long)local_500.ray + 0x44) = *(float *)(local_500.hit + 0x14);
                        *(float *)((long)local_500.ray + 0x48) = *(float *)(local_500.hit + 0x18);
                        *(float *)((long)local_500.ray + 0x4c) = *(float *)(local_500.hit + 0x1c);
                        *(float *)((long)local_500.ray + 0x50) = *(float *)(local_500.hit + 0x20);
                      }
                      else {
                        auVar180 = ZEXT464((uint)fVar146);
                        auVar186 = ZEXT1664(auVar76);
                        auVar193 = ZEXT1664(auVar79);
                        (*pGVar65->intersectionFilterN)(&local_500);
                        auVar206 = ZEXT3264(local_460);
                        auVar210 = ZEXT3264(local_480);
                        auVar200 = ZEXT1664(local_4d0);
                        auVar198 = ZEXT1664(local_4c0);
                        ray = local_540;
                        context = local_548;
                        if (*local_500.valid != 0) goto LAB_01ace770;
LAB_01ace821:
                        (local_540->super_RayK<1>).tfar = (float)local_400._0_4_;
                        ray = local_540;
                        context = local_548;
                      }
                      bVar69 = ~(byte)(1 << ((uint)uVar61 & 0x1f)) & (byte)uVar67;
                      fVar161 = (ray->super_RayK<1>).tfar;
                      auVar34._4_4_ = fVar161;
                      auVar34._0_4_ = fVar161;
                      auVar34._8_4_ = fVar161;
                      auVar34._12_4_ = fVar161;
                      auVar34._16_4_ = fVar161;
                      auVar34._20_4_ = fVar161;
                      auVar34._24_4_ = fVar161;
                      auVar34._28_4_ = fVar161;
                      uVar21 = vcmpps_avx512vl(auVar206._0_32_,auVar34,2);
                      prim = local_508;
                      pre = local_510;
                      if ((bVar69 & (byte)uVar21) == 0) goto LAB_01acd8e1;
                      local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                      bVar69 = bVar69 & (byte)uVar21;
                      uVar67 = (ulong)bVar69;
                      auVar145._8_4_ = 0x7f800000;
                      auVar145._0_8_ = 0x7f8000007f800000;
                      auVar145._12_4_ = 0x7f800000;
                      auVar145._16_4_ = 0x7f800000;
                      auVar145._20_4_ = 0x7f800000;
                      auVar145._24_4_ = 0x7f800000;
                      auVar145._28_4_ = 0x7f800000;
                      auVar95 = vblendmps_avx512vl(auVar145,auVar206._0_32_);
                      auVar123._0_4_ =
                           (uint)(bVar69 & 1) * auVar95._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * 0x7f800000;
                      bVar11 = (bool)(bVar69 >> 1 & 1);
                      auVar123._4_4_ = (uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar69 >> 2 & 1);
                      auVar123._8_4_ = (uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar69 >> 3 & 1);
                      auVar123._12_4_ = (uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar69 >> 4 & 1);
                      auVar123._16_4_ = (uint)bVar11 * auVar95._16_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar69 >> 5 & 1);
                      auVar123._20_4_ = (uint)bVar11 * auVar95._20_4_ | (uint)!bVar11 * 0x7f800000;
                      bVar11 = (bool)(bVar69 >> 6 & 1);
                      auVar123._24_4_ = (uint)bVar11 * auVar95._24_4_ | (uint)!bVar11 * 0x7f800000;
                      auVar123._28_4_ =
                           (uint)(bVar69 >> 7) * auVar95._28_4_ |
                           (uint)!(bool)(bVar69 >> 7) * 0x7f800000;
                      auVar95 = vshufps_avx(auVar123,auVar123,0xb1);
                      auVar95 = vminps_avx(auVar123,auVar95);
                      auVar96 = vshufpd_avx(auVar95,auVar95,5);
                      auVar95 = vminps_avx(auVar95,auVar96);
                      auVar96 = vpermpd_avx2(auVar95,0x4e);
                      auVar95 = vminps_avx(auVar95,auVar96);
                      uVar21 = vcmpps_avx512vl(auVar123,auVar95,0);
                      bVar60 = (byte)uVar21 & bVar69;
                      if (bVar60 != 0) {
                        bVar69 = bVar60;
                      }
                      uVar66 = 0;
                      for (uVar63 = (uint)bVar69; (uVar63 & 1) == 0;
                          uVar63 = uVar63 >> 1 | 0x80000000) {
                        uVar66 = uVar66 + 1;
                      }
                      uVar61 = (ulong)uVar66;
                    } while( true );
                  }
                  fVar161 = local_200[uVar61];
                  fVar146 = *(float *)(local_1e0 + uVar61 * 4);
                  fVar147 = 1.0 - fVar161;
                  auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar161 * (fVar147 + fVar147))),
                                             ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                  auVar79 = ZEXT416((uint)fVar161);
                  auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                            ZEXT416(0xc0a00000));
                  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161 * 3.0)),
                                            ZEXT416((uint)(fVar161 + fVar161)),auVar76);
                  auVar193 = ZEXT1664(auVar74);
                  auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                            ZEXT416(0x40000000));
                  auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * -3.0)),
                                            ZEXT416((uint)(fVar147 + fVar147)),auVar76);
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),auVar79,
                                            ZEXT416((uint)(fVar147 * -2.0)));
                  fVar147 = auVar17._0_4_ * 0.5;
                  fVar70 = auVar74._0_4_ * 0.5;
                  fVar71 = auVar76._0_4_ * 0.5;
                  fVar124 = auVar79._0_4_ * 0.5;
                  auVar164._0_4_ = fVar124 * local_530;
                  auVar164._4_4_ = fVar124 * fStack_52c;
                  auVar164._8_4_ = fVar124 * fStack_528;
                  auVar164._12_4_ = fVar124 * fStack_524;
                  auVar182._4_4_ = fVar71;
                  auVar182._0_4_ = fVar71;
                  auVar182._8_4_ = fVar71;
                  auVar182._12_4_ = fVar71;
                  auVar76 = vfmadd132ps_fma(auVar182,auVar164,*pauVar3);
                  auVar186 = ZEXT1664(auVar76);
                  auVar165._4_4_ = fVar70;
                  auVar165._0_4_ = fVar70;
                  auVar165._8_4_ = fVar70;
                  auVar165._12_4_ = fVar70;
                  auVar76 = vfmadd213ps_fma(auVar165,local_4d0,auVar76);
                  auVar155._4_4_ = fVar147;
                  auVar155._0_4_ = fVar147;
                  auVar155._8_4_ = fVar147;
                  auVar155._12_4_ = fVar147;
                  auVar180 = ZEXT464((uint)*(float *)(local_1c0 + uVar61 * 4));
                  (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar61 * 4);
                  auVar76 = vfmadd213ps_fma(auVar155,local_4c0,auVar76);
                  uVar21 = vmovlps_avx(auVar76);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                  fVar147 = (float)vextractps_avx(auVar76,2);
                  (ray->Ng).field_0.field_0.z = fVar147;
                  ray->u = fVar161;
                  ray->v = fVar146;
                  ray->primID = uVar63;
                  ray->geomID = uVar66;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                  prim = local_508;
                  pre = local_510;
                }
              }
            }
          }
        }
      }
LAB_01acd8e1:
      if (8 < iVar9) {
        auVar95 = vpbroadcastd_avx512vl();
        auVar206 = ZEXT3264(auVar95);
        local_400._4_4_ = local_420._0_4_;
        local_400._0_4_ = local_420._0_4_;
        local_400._8_4_ = local_420._0_4_;
        local_400._12_4_ = local_420._0_4_;
        local_400._16_4_ = local_420._0_4_;
        local_400._20_4_ = local_420._0_4_;
        local_400._24_4_ = local_420._0_4_;
        local_400._28_4_ = local_420._0_4_;
        auVar142._8_4_ = 3;
        auVar142._0_8_ = 0x300000003;
        auVar142._12_4_ = 3;
        auVar142._16_4_ = 3;
        auVar142._20_4_ = 3;
        auVar142._24_4_ = 3;
        auVar142._28_4_ = 3;
        local_3e0 = vpermps_avx2(auVar142,local_3e0);
        local_100 = 1.0 / (float)local_440._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        lVar64 = 8;
        local_480 = auVar210._0_32_;
LAB_01acd970:
        auVar95 = vpbroadcastd_avx512vl();
        auVar95 = vpor_avx2(auVar95,_DAT_01fe9900);
        uVar22 = vpcmpgtd_avx512vl(auVar206._0_32_,auVar95);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar64 * 4 + lVar25);
        auVar96 = *(undefined1 (*) [32])(lVar25 + 0x21b37f0 + lVar64 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar25 + 0x21b3c74 + lVar64 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar25 + 0x21b40f8 + lVar64 * 4);
        auVar198._0_4_ = auVar98._0_4_ * (float)local_3a0._0_4_;
        auVar198._4_4_ = auVar98._4_4_ * (float)local_3a0._4_4_;
        auVar198._8_4_ = auVar98._8_4_ * fStack_398;
        auVar198._12_4_ = auVar98._12_4_ * fStack_394;
        auVar198._16_4_ = auVar98._16_4_ * fStack_390;
        auVar198._20_4_ = auVar98._20_4_ * fStack_38c;
        auVar198._28_36_ = auVar186._28_36_;
        auVar198._24_4_ = auVar98._24_4_ * fStack_388;
        auVar186._0_4_ = auVar98._0_4_ * (float)local_3c0._0_4_;
        auVar186._4_4_ = auVar98._4_4_ * (float)local_3c0._4_4_;
        auVar186._8_4_ = auVar98._8_4_ * fStack_3b8;
        auVar186._12_4_ = auVar98._12_4_ * fStack_3b4;
        auVar186._16_4_ = auVar98._16_4_ * fStack_3b0;
        auVar186._20_4_ = auVar98._20_4_ * fStack_3ac;
        auVar186._28_36_ = auVar180._28_36_;
        auVar186._24_4_ = auVar98._24_4_ * fStack_3a8;
        auVar90 = auVar210._0_32_;
        auVar97 = vmulps_avx512vl(local_e0,auVar98);
        auVar82 = vfmadd231ps_avx512vl(auVar198._0_32_,auVar101,local_360);
        auVar83 = vfmadd231ps_avx512vl(auVar186._0_32_,auVar101,local_380);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,local_c0);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar96,local_320);
        auVar83 = vfmadd231ps_avx512vl(auVar83,auVar96,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar97,auVar96,local_a0);
        auVar76 = vfmadd231ps_fma(auVar82,auVar95,local_2e0);
        auVar186 = ZEXT1664(auVar76);
        auVar74 = vfmadd231ps_fma(auVar83,auVar95,local_300);
        auVar180 = ZEXT1664(auVar74);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar64 * 4 + lVar25);
        auVar82 = *(undefined1 (*) [32])(lVar25 + 0x21b5c10 + lVar64 * 4);
        auVar85 = vfmadd231ps_avx512vl(auVar99,auVar95,local_80);
        auVar83 = *(undefined1 (*) [32])(lVar25 + 0x21b6094 + lVar64 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar25 + 0x21b6518 + lVar64 * 4);
        auVar200._0_4_ = auVar99._0_4_ * (float)local_3a0._0_4_;
        auVar200._4_4_ = auVar99._4_4_ * (float)local_3a0._4_4_;
        auVar200._8_4_ = auVar99._8_4_ * fStack_398;
        auVar200._12_4_ = auVar99._12_4_ * fStack_394;
        auVar200._16_4_ = auVar99._16_4_ * fStack_390;
        auVar200._20_4_ = auVar99._20_4_ * fStack_38c;
        auVar200._28_36_ = auVar193._28_36_;
        auVar200._24_4_ = auVar99._24_4_ * fStack_388;
        auVar39._4_4_ = auVar99._4_4_ * (float)local_3c0._4_4_;
        auVar39._0_4_ = auVar99._0_4_ * (float)local_3c0._0_4_;
        auVar39._8_4_ = auVar99._8_4_ * fStack_3b8;
        auVar39._12_4_ = auVar99._12_4_ * fStack_3b4;
        auVar39._16_4_ = auVar99._16_4_ * fStack_3b0;
        auVar39._20_4_ = auVar99._20_4_ * fStack_3ac;
        auVar39._24_4_ = auVar99._24_4_ * fStack_3a8;
        auVar39._28_4_ = uStack_3a4;
        auVar100 = vmulps_avx512vl(local_e0,auVar99);
        auVar210 = ZEXT3264(auVar90);
        auVar84 = vfmadd231ps_avx512vl(auVar200._0_32_,auVar83,local_360);
        auVar86 = vfmadd231ps_avx512vl(auVar39,auVar83,local_380);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar83,local_c0);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar82,local_320);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,local_340);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar82,local_a0);
        auVar79 = vfmadd231ps_fma(auVar84,auVar97,local_2e0);
        auVar193 = ZEXT1664(auVar79);
        auVar17 = vfmadd231ps_fma(auVar86,auVar97,local_300);
        auVar86 = vfmadd231ps_avx512vl(auVar100,auVar97,local_80);
        auVar87 = vmaxps_avx512vl(auVar85,auVar86);
        auVar100 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar76));
        auVar84 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar74));
        auVar88 = vmulps_avx512vl(ZEXT1632(auVar74),auVar100);
        auVar89 = vmulps_avx512vl(ZEXT1632(auVar76),auVar84);
        auVar88 = vsubps_avx512vl(auVar88,auVar89);
        auVar89 = vmulps_avx512vl(auVar84,auVar84);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar100,auVar100);
        auVar87 = vmulps_avx512vl(auVar87,auVar87);
        auVar87 = vmulps_avx512vl(auVar87,auVar89);
        auVar88 = vmulps_avx512vl(auVar88,auVar88);
        uVar21 = vcmpps_avx512vl(auVar88,auVar87,2);
        bVar69 = (byte)uVar22 & (byte)uVar21;
        if (bVar69 != 0) {
          auVar99 = vmulps_avx512vl(local_180,auVar99);
          auVar83 = vfmadd213ps_avx512vl(auVar83,local_160,auVar99);
          auVar82 = vfmadd213ps_avx512vl(auVar82,local_140,auVar83);
          auVar97 = vfmadd213ps_avx512vl(auVar97,auVar90,auVar82);
          auVar98 = vmulps_avx512vl(local_180,auVar98);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar98);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar101);
          auVar82 = vfmadd213ps_avx512vl(auVar95,auVar90,auVar96);
          auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b457c + lVar64 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar25 + 0x21b4a00 + lVar64 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar25 + 0x21b4e84 + lVar64 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar25 + 0x21b5308 + lVar64 * 4);
          auVar83 = vmulps_avx512vl(_local_3a0,auVar98);
          auVar99 = vmulps_avx512vl(_local_3c0,auVar98);
          auVar98 = vmulps_avx512vl(local_180,auVar98);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar101,local_360);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_380);
          auVar101 = vfmadd231ps_avx512vl(auVar98,local_160,auVar101);
          auVar98 = vfmadd231ps_avx512vl(auVar83,auVar96,local_320);
          auVar83 = vfmadd231ps_avx512vl(auVar99,auVar96,local_340);
          auVar96 = vfmadd231ps_avx512vl(auVar101,local_140,auVar96);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_2e0);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar95,local_300);
          auVar77 = vfmadd231ps_fma(auVar96,auVar95,local_480);
          auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b699c + lVar64 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar25 + 0x21b72a4 + lVar64 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar25 + 0x21b7728 + lVar64 * 4);
          auVar99 = vmulps_avx512vl(_local_3a0,auVar101);
          auVar87 = vmulps_avx512vl(_local_3c0,auVar101);
          auVar101 = vmulps_avx512vl(local_180,auVar101);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_360);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar96,local_380);
          auVar101 = vfmadd231ps_avx512vl(auVar101,local_160,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar25 + 0x21b6e20 + lVar64 * 4);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_320);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar96,local_340);
          auVar210 = ZEXT3264(local_480);
          auVar96 = vfmadd231ps_avx512vl(auVar101,local_140,auVar96);
          auVar101 = vfmadd231ps_avx512vl(auVar99,auVar95,local_2e0);
          auVar99 = vfmadd231ps_avx512vl(auVar87,auVar95,local_300);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_480,auVar95);
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar98,auVar87);
          vandps_avx512vl(auVar83,auVar87);
          auVar95 = vmaxps_avx(auVar87,auVar87);
          vandps_avx512vl(ZEXT1632(auVar77),auVar87);
          auVar95 = vmaxps_avx(auVar95,auVar87);
          uVar61 = vcmpps_avx512vl(auVar95,local_400,1);
          bVar11 = (bool)((byte)uVar61 & 1);
          auVar111._0_4_ = (float)((uint)bVar11 * auVar100._0_4_ | (uint)!bVar11 * auVar98._0_4_);
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar111._4_4_ = (float)((uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar98._4_4_);
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar111._8_4_ = (float)((uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar98._8_4_);
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar111._12_4_ = (float)((uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar98._12_4_)
          ;
          bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar111._16_4_ = (float)((uint)bVar11 * auVar100._16_4_ | (uint)!bVar11 * auVar98._16_4_)
          ;
          bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar111._20_4_ = (float)((uint)bVar11 * auVar100._20_4_ | (uint)!bVar11 * auVar98._20_4_)
          ;
          bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar111._24_4_ = (float)((uint)bVar11 * auVar100._24_4_ | (uint)!bVar11 * auVar98._24_4_)
          ;
          bVar11 = SUB81(uVar61 >> 7,0);
          auVar111._28_4_ = (uint)bVar11 * auVar100._28_4_ | (uint)!bVar11 * auVar98._28_4_;
          bVar11 = (bool)((byte)uVar61 & 1);
          auVar112._0_4_ = (float)((uint)bVar11 * auVar84._0_4_ | (uint)!bVar11 * auVar83._0_4_);
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar112._4_4_ = (float)((uint)bVar11 * auVar84._4_4_ | (uint)!bVar11 * auVar83._4_4_);
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar112._8_4_ = (float)((uint)bVar11 * auVar84._8_4_ | (uint)!bVar11 * auVar83._8_4_);
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar112._12_4_ = (float)((uint)bVar11 * auVar84._12_4_ | (uint)!bVar11 * auVar83._12_4_);
          bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar112._16_4_ = (float)((uint)bVar11 * auVar84._16_4_ | (uint)!bVar11 * auVar83._16_4_);
          bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar112._20_4_ = (float)((uint)bVar11 * auVar84._20_4_ | (uint)!bVar11 * auVar83._20_4_);
          bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar112._24_4_ = (float)((uint)bVar11 * auVar84._24_4_ | (uint)!bVar11 * auVar83._24_4_);
          bVar11 = SUB81(uVar61 >> 7,0);
          auVar112._28_4_ = (uint)bVar11 * auVar84._28_4_ | (uint)!bVar11 * auVar83._28_4_;
          vandps_avx512vl(auVar101,auVar87);
          vandps_avx512vl(auVar99,auVar87);
          auVar95 = vmaxps_avx(auVar112,auVar112);
          vandps_avx512vl(auVar96,auVar87);
          auVar95 = vmaxps_avx(auVar95,auVar112);
          uVar61 = vcmpps_avx512vl(auVar95,local_400,1);
          bVar11 = (bool)((byte)uVar61 & 1);
          auVar113._0_4_ = (uint)bVar11 * auVar100._0_4_ | (uint)!bVar11 * auVar101._0_4_;
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar113._4_4_ = (uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar101._4_4_;
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar113._8_4_ = (uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar101._8_4_;
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar113._12_4_ = (uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar101._12_4_;
          bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar113._16_4_ = (uint)bVar11 * auVar100._16_4_ | (uint)!bVar11 * auVar101._16_4_;
          bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar113._20_4_ = (uint)bVar11 * auVar100._20_4_ | (uint)!bVar11 * auVar101._20_4_;
          bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar113._24_4_ = (uint)bVar11 * auVar100._24_4_ | (uint)!bVar11 * auVar101._24_4_;
          bVar11 = SUB81(uVar61 >> 7,0);
          auVar113._28_4_ = (uint)bVar11 * auVar100._28_4_ | (uint)!bVar11 * auVar101._28_4_;
          bVar11 = (bool)((byte)uVar61 & 1);
          auVar114._0_4_ = (float)((uint)bVar11 * auVar84._0_4_ | (uint)!bVar11 * auVar99._0_4_);
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar11 * auVar84._4_4_ | (uint)!bVar11 * auVar99._4_4_);
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar11 * auVar84._8_4_ | (uint)!bVar11 * auVar99._8_4_);
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar11 * auVar84._12_4_ | (uint)!bVar11 * auVar99._12_4_);
          bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar11 * auVar84._16_4_ | (uint)!bVar11 * auVar99._16_4_);
          bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar11 * auVar84._20_4_ | (uint)!bVar11 * auVar99._20_4_);
          bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar11 * auVar84._24_4_ | (uint)!bVar11 * auVar99._24_4_);
          bVar11 = SUB81(uVar61 >> 7,0);
          auVar114._28_4_ = (uint)bVar11 * auVar84._28_4_ | (uint)!bVar11 * auVar99._28_4_;
          auVar197._8_4_ = 0x80000000;
          auVar197._0_8_ = 0x8000000080000000;
          auVar197._12_4_ = 0x80000000;
          auVar197._16_4_ = 0x80000000;
          auVar197._20_4_ = 0x80000000;
          auVar197._24_4_ = 0x80000000;
          auVar197._28_4_ = 0x80000000;
          auVar95 = vxorps_avx512vl(auVar113,auVar197);
          auVar81 = vxorps_avx512vl(auVar87._0_16_,auVar87._0_16_);
          auVar96 = vfmadd213ps_avx512vl(auVar111,auVar111,ZEXT1632(auVar81));
          auVar77 = vfmadd231ps_fma(auVar96,auVar112,auVar112);
          auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
          auVar209._8_4_ = 0xbf000000;
          auVar209._0_8_ = 0xbf000000bf000000;
          auVar209._12_4_ = 0xbf000000;
          auVar209._16_4_ = 0xbf000000;
          auVar209._20_4_ = 0xbf000000;
          auVar209._24_4_ = 0xbf000000;
          auVar209._28_4_ = 0xbf000000;
          fVar161 = auVar96._0_4_;
          fVar146 = auVar96._4_4_;
          fVar147 = auVar96._8_4_;
          fVar70 = auVar96._12_4_;
          fVar71 = auVar96._16_4_;
          fVar124 = auVar96._20_4_;
          fVar125 = auVar96._24_4_;
          auVar40._4_4_ = fVar146 * fVar146 * fVar146 * auVar77._4_4_ * -0.5;
          auVar40._0_4_ = fVar161 * fVar161 * fVar161 * auVar77._0_4_ * -0.5;
          auVar40._8_4_ = fVar147 * fVar147 * fVar147 * auVar77._8_4_ * -0.5;
          auVar40._12_4_ = fVar70 * fVar70 * fVar70 * auVar77._12_4_ * -0.5;
          auVar40._16_4_ = fVar71 * fVar71 * fVar71 * -0.0;
          auVar40._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
          auVar40._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
          auVar40._28_4_ = auVar112._28_4_;
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar96 = vfmadd231ps_avx512vl(auVar40,auVar101,auVar96);
          auVar41._4_4_ = auVar112._4_4_ * auVar96._4_4_;
          auVar41._0_4_ = auVar112._0_4_ * auVar96._0_4_;
          auVar41._8_4_ = auVar112._8_4_ * auVar96._8_4_;
          auVar41._12_4_ = auVar112._12_4_ * auVar96._12_4_;
          auVar41._16_4_ = auVar112._16_4_ * auVar96._16_4_;
          auVar41._20_4_ = auVar112._20_4_ * auVar96._20_4_;
          auVar41._24_4_ = auVar112._24_4_ * auVar96._24_4_;
          auVar41._28_4_ = 0;
          auVar42._4_4_ = auVar96._4_4_ * -auVar111._4_4_;
          auVar42._0_4_ = auVar96._0_4_ * -auVar111._0_4_;
          auVar42._8_4_ = auVar96._8_4_ * -auVar111._8_4_;
          auVar42._12_4_ = auVar96._12_4_ * -auVar111._12_4_;
          auVar42._16_4_ = auVar96._16_4_ * -auVar111._16_4_;
          auVar42._20_4_ = auVar96._20_4_ * -auVar111._20_4_;
          auVar42._24_4_ = auVar96._24_4_ * -auVar111._24_4_;
          auVar42._28_4_ = auVar112._28_4_;
          auVar98 = vmulps_avx512vl(auVar96,ZEXT1632(auVar81));
          auVar99 = ZEXT1632(auVar81);
          auVar96 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar99);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar114,auVar114);
          auVar83 = vrsqrt14ps_avx512vl(auVar96);
          auVar96 = vmulps_avx512vl(auVar96,auVar209);
          fVar161 = auVar83._0_4_;
          fVar146 = auVar83._4_4_;
          fVar147 = auVar83._8_4_;
          fVar70 = auVar83._12_4_;
          fVar71 = auVar83._16_4_;
          fVar124 = auVar83._20_4_;
          fVar125 = auVar83._24_4_;
          auVar43._4_4_ = fVar146 * fVar146 * fVar146 * auVar96._4_4_;
          auVar43._0_4_ = fVar161 * fVar161 * fVar161 * auVar96._0_4_;
          auVar43._8_4_ = fVar147 * fVar147 * fVar147 * auVar96._8_4_;
          auVar43._12_4_ = fVar70 * fVar70 * fVar70 * auVar96._12_4_;
          auVar43._16_4_ = fVar71 * fVar71 * fVar71 * auVar96._16_4_;
          auVar43._20_4_ = fVar124 * fVar124 * fVar124 * auVar96._20_4_;
          auVar43._24_4_ = fVar125 * fVar125 * fVar125 * auVar96._24_4_;
          auVar43._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar43,auVar101,auVar83);
          auVar44._4_4_ = auVar114._4_4_ * auVar96._4_4_;
          auVar44._0_4_ = auVar114._0_4_ * auVar96._0_4_;
          auVar44._8_4_ = auVar114._8_4_ * auVar96._8_4_;
          auVar44._12_4_ = auVar114._12_4_ * auVar96._12_4_;
          auVar44._16_4_ = auVar114._16_4_ * auVar96._16_4_;
          auVar44._20_4_ = auVar114._20_4_ * auVar96._20_4_;
          auVar44._24_4_ = auVar114._24_4_ * auVar96._24_4_;
          auVar44._28_4_ = auVar83._28_4_;
          auVar45._4_4_ = auVar96._4_4_ * auVar95._4_4_;
          auVar45._0_4_ = auVar96._0_4_ * auVar95._0_4_;
          auVar45._8_4_ = auVar96._8_4_ * auVar95._8_4_;
          auVar45._12_4_ = auVar96._12_4_ * auVar95._12_4_;
          auVar45._16_4_ = auVar96._16_4_ * auVar95._16_4_;
          auVar45._20_4_ = auVar96._20_4_ * auVar95._20_4_;
          auVar45._24_4_ = auVar96._24_4_ * auVar95._24_4_;
          auVar45._28_4_ = auVar95._28_4_;
          auVar95 = vmulps_avx512vl(auVar96,auVar99);
          auVar77 = vfmadd213ps_fma(auVar41,auVar85,ZEXT1632(auVar76));
          auVar18 = vfmadd213ps_fma(auVar42,auVar85,ZEXT1632(auVar74));
          auVar101 = vfmadd213ps_avx512vl(auVar98,auVar85,auVar82);
          auVar83 = vfmadd213ps_avx512vl(auVar44,auVar86,ZEXT1632(auVar79));
          auVar20 = vfnmadd213ps_fma(auVar41,auVar85,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar45,auVar86,ZEXT1632(auVar17));
          auVar78 = vfnmadd213ps_fma(auVar42,auVar85,ZEXT1632(auVar74));
          auVar74 = vfmadd213ps_fma(auVar95,auVar86,auVar97);
          auVar73 = vfnmadd231ps_fma(auVar82,auVar85,auVar98);
          auVar80 = vfnmadd213ps_fma(auVar44,auVar86,ZEXT1632(auVar79));
          auVar75 = vfnmadd213ps_fma(auVar45,auVar86,ZEXT1632(auVar17));
          auVar72 = vfnmadd231ps_fma(auVar97,auVar86,auVar95);
          auVar97 = vsubps_avx512vl(auVar83,ZEXT1632(auVar20));
          auVar95 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar78));
          auVar96 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar73));
          auVar46._4_4_ = auVar95._4_4_ * auVar73._4_4_;
          auVar46._0_4_ = auVar95._0_4_ * auVar73._0_4_;
          auVar46._8_4_ = auVar95._8_4_ * auVar73._8_4_;
          auVar46._12_4_ = auVar95._12_4_ * auVar73._12_4_;
          auVar46._16_4_ = auVar95._16_4_ * 0.0;
          auVar46._20_4_ = auVar95._20_4_ * 0.0;
          auVar46._24_4_ = auVar95._24_4_ * 0.0;
          auVar46._28_4_ = auVar98._28_4_;
          auVar79 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar78),auVar96);
          auVar47._4_4_ = auVar96._4_4_ * auVar20._4_4_;
          auVar47._0_4_ = auVar96._0_4_ * auVar20._0_4_;
          auVar47._8_4_ = auVar96._8_4_ * auVar20._8_4_;
          auVar47._12_4_ = auVar96._12_4_ * auVar20._12_4_;
          auVar47._16_4_ = auVar96._16_4_ * 0.0;
          auVar47._20_4_ = auVar96._20_4_ * 0.0;
          auVar47._24_4_ = auVar96._24_4_ * 0.0;
          auVar47._28_4_ = auVar96._28_4_;
          auVar17 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar73),auVar97);
          auVar48._4_4_ = auVar78._4_4_ * auVar97._4_4_;
          auVar48._0_4_ = auVar78._0_4_ * auVar97._0_4_;
          auVar48._8_4_ = auVar78._8_4_ * auVar97._8_4_;
          auVar48._12_4_ = auVar78._12_4_ * auVar97._12_4_;
          auVar48._16_4_ = auVar97._16_4_ * 0.0;
          auVar48._20_4_ = auVar97._20_4_ * 0.0;
          auVar48._24_4_ = auVar97._24_4_ * 0.0;
          auVar48._28_4_ = auVar97._28_4_;
          auVar19 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar20),auVar95);
          auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar99,ZEXT1632(auVar17));
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,ZEXT1632(auVar79));
          auVar88 = ZEXT1632(auVar81);
          uVar61 = vcmpps_avx512vl(auVar95,auVar88,2);
          bVar60 = (byte)uVar61;
          fVar132 = (float)((uint)(bVar60 & 1) * auVar77._0_4_ |
                           (uint)!(bool)(bVar60 & 1) * auVar80._0_4_);
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          fVar126 = (float)((uint)bVar11 * auVar77._4_4_ | (uint)!bVar11 * auVar80._4_4_);
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          fVar130 = (float)((uint)bVar11 * auVar77._8_4_ | (uint)!bVar11 * auVar80._8_4_);
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          fVar134 = (float)((uint)bVar11 * auVar77._12_4_ | (uint)!bVar11 * auVar80._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar130,CONCAT44(fVar126,fVar132))));
          fVar133 = (float)((uint)(bVar60 & 1) * auVar18._0_4_ |
                           (uint)!(bool)(bVar60 & 1) * auVar75._0_4_);
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          fVar127 = (float)((uint)bVar11 * auVar18._4_4_ | (uint)!bVar11 * auVar75._4_4_);
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          fVar131 = (float)((uint)bVar11 * auVar18._8_4_ | (uint)!bVar11 * auVar75._8_4_);
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          fVar135 = (float)((uint)bVar11 * auVar18._12_4_ | (uint)!bVar11 * auVar75._12_4_);
          auVar100 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar131,CONCAT44(fVar127,fVar133))));
          auVar115._0_4_ =
               (float)((uint)(bVar60 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar72._0_4_);
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar72._4_4_);
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar72._8_4_);
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar72._12_4_)
          ;
          fVar161 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar101._16_4_);
          auVar115._16_4_ = fVar161;
          fVar146 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar101._20_4_);
          auVar115._20_4_ = fVar146;
          fVar147 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar101._24_4_);
          auVar115._24_4_ = fVar147;
          iVar1 = (uint)(byte)(uVar61 >> 7) * auVar101._28_4_;
          auVar115._28_4_ = iVar1;
          auVar95 = vblendmps_avx512vl(ZEXT1632(auVar20),auVar83);
          auVar116._0_4_ =
               (uint)(bVar60 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar79._0_4_;
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar79._4_4_;
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar79._8_4_;
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar79._12_4_;
          auVar116._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * auVar95._16_4_;
          auVar116._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * auVar95._20_4_;
          auVar116._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * auVar95._24_4_;
          auVar116._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar95._28_4_;
          auVar95 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar76));
          auVar117._0_4_ =
               (float)((uint)(bVar60 & 1) * auVar95._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar77._0_4_);
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar77._4_4_);
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar77._8_4_);
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar77._12_4_);
          fVar70 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar95._16_4_);
          auVar117._16_4_ = fVar70;
          fVar71 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar95._20_4_);
          auVar117._20_4_ = fVar71;
          fVar124 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar95._24_4_);
          auVar117._24_4_ = fVar124;
          auVar117._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar95._28_4_;
          auVar95 = vblendmps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar74));
          auVar118._0_4_ =
               (float)((uint)(bVar60 & 1) * auVar95._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar18._0_4_);
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar18._4_4_);
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar18._8_4_);
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar18._12_4_);
          fVar129 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar95._16_4_);
          auVar118._16_4_ = fVar129;
          fVar125 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar95._20_4_);
          auVar118._20_4_ = fVar125;
          fVar128 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar95._24_4_);
          auVar118._24_4_ = fVar128;
          iVar2 = (uint)(byte)(uVar61 >> 7) * auVar95._28_4_;
          auVar118._28_4_ = iVar2;
          auVar119._0_4_ =
               (uint)(bVar60 & 1) * (int)auVar20._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar83._0_4_;
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar11 * (int)auVar20._4_4_ | (uint)!bVar11 * auVar83._4_4_;
          bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar11 * (int)auVar20._8_4_ | (uint)!bVar11 * auVar83._8_4_;
          bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar11 * (int)auVar20._12_4_ | (uint)!bVar11 * auVar83._12_4_;
          auVar119._16_4_ = (uint)!(bool)((byte)(uVar61 >> 4) & 1) * auVar83._16_4_;
          auVar119._20_4_ = (uint)!(bool)((byte)(uVar61 >> 5) & 1) * auVar83._20_4_;
          auVar119._24_4_ = (uint)!(bool)((byte)(uVar61 >> 6) & 1) * auVar83._24_4_;
          auVar119._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar83._28_4_;
          bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar61 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar61 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar61 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar83 = vsubps_avx512vl(auVar119,auVar99);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar78._12_4_ |
                                                  (uint)!bVar15 * auVar76._12_4_,
                                                  CONCAT48((uint)bVar13 * (int)auVar78._8_4_ |
                                                           (uint)!bVar13 * auVar76._8_4_,
                                                           CONCAT44((uint)bVar11 *
                                                                    (int)auVar78._4_4_ |
                                                                    (uint)!bVar11 * auVar76._4_4_,
                                                                    (uint)(bVar60 & 1) *
                                                                    (int)auVar78._0_4_ |
                                                                    (uint)!(bool)(bVar60 & 1) *
                                                                    auVar76._0_4_)))),auVar100);
          auVar186 = ZEXT3264(auVar96);
          auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar73._12_4_ |
                                                   (uint)!bVar16 * auVar74._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar73._8_4_ |
                                                            (uint)!bVar14 * auVar74._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar73._4_4_ |
                                                                     (uint)!bVar12 * auVar74._4_4_,
                                                                     (uint)(bVar60 & 1) *
                                                                     (int)auVar73._0_4_ |
                                                                     (uint)!(bool)(bVar60 & 1) *
                                                                     auVar74._0_4_)))),auVar115);
          auVar98 = vsubps_avx(auVar99,auVar116);
          auVar193 = ZEXT3264(auVar98);
          auVar97 = vsubps_avx(auVar100,auVar117);
          auVar82 = vsubps_avx(auVar115,auVar118);
          auVar49._4_4_ = auVar101._4_4_ * fVar126;
          auVar49._0_4_ = auVar101._0_4_ * fVar132;
          auVar49._8_4_ = auVar101._8_4_ * fVar130;
          auVar49._12_4_ = auVar101._12_4_ * fVar134;
          auVar49._16_4_ = auVar101._16_4_ * 0.0;
          auVar49._20_4_ = auVar101._20_4_ * 0.0;
          auVar49._24_4_ = auVar101._24_4_ * 0.0;
          auVar49._28_4_ = 0;
          auVar76 = vfmsub231ps_fma(auVar49,auVar115,auVar83);
          auVar173._0_4_ = fVar133 * auVar83._0_4_;
          auVar173._4_4_ = fVar127 * auVar83._4_4_;
          auVar173._8_4_ = fVar131 * auVar83._8_4_;
          auVar173._12_4_ = fVar135 * auVar83._12_4_;
          auVar173._16_4_ = auVar83._16_4_ * 0.0;
          auVar173._20_4_ = auVar83._20_4_ * 0.0;
          auVar173._24_4_ = auVar83._24_4_ * 0.0;
          auVar173._28_4_ = 0;
          auVar74 = vfmsub231ps_fma(auVar173,auVar99,auVar96);
          auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar88,ZEXT1632(auVar76));
          auVar178._0_4_ = auVar96._0_4_ * auVar115._0_4_;
          auVar178._4_4_ = auVar96._4_4_ * auVar115._4_4_;
          auVar178._8_4_ = auVar96._8_4_ * auVar115._8_4_;
          auVar178._12_4_ = auVar96._12_4_ * auVar115._12_4_;
          auVar178._16_4_ = auVar96._16_4_ * fVar161;
          auVar178._20_4_ = auVar96._20_4_ * fVar146;
          auVar178._24_4_ = auVar96._24_4_ * fVar147;
          auVar178._28_4_ = 0;
          auVar76 = vfmsub231ps_fma(auVar178,auVar100,auVar101);
          auVar84 = vfmadd231ps_avx512vl(auVar95,auVar88,ZEXT1632(auVar76));
          auVar95 = vmulps_avx512vl(auVar82,auVar116);
          auVar95 = vfmsub231ps_avx512vl(auVar95,auVar98,auVar118);
          auVar50._4_4_ = auVar97._4_4_ * auVar118._4_4_;
          auVar50._0_4_ = auVar97._0_4_ * auVar118._0_4_;
          auVar50._8_4_ = auVar97._8_4_ * auVar118._8_4_;
          auVar50._12_4_ = auVar97._12_4_ * auVar118._12_4_;
          auVar50._16_4_ = auVar97._16_4_ * fVar129;
          auVar50._20_4_ = auVar97._20_4_ * fVar125;
          auVar50._24_4_ = auVar97._24_4_ * fVar128;
          auVar50._28_4_ = iVar2;
          auVar76 = vfmsub231ps_fma(auVar50,auVar117,auVar82);
          auVar179._0_4_ = auVar117._0_4_ * auVar98._0_4_;
          auVar179._4_4_ = auVar117._4_4_ * auVar98._4_4_;
          auVar179._8_4_ = auVar117._8_4_ * auVar98._8_4_;
          auVar179._12_4_ = auVar117._12_4_ * auVar98._12_4_;
          auVar179._16_4_ = fVar70 * auVar98._16_4_;
          auVar179._20_4_ = fVar71 * auVar98._20_4_;
          auVar179._24_4_ = fVar124 * auVar98._24_4_;
          auVar179._28_4_ = 0;
          auVar74 = vfmsub231ps_fma(auVar179,auVar97,auVar116);
          auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar88,auVar95);
          auVar87 = vfmadd231ps_avx512vl(auVar95,auVar88,ZEXT1632(auVar76));
          auVar180 = ZEXT3264(auVar87);
          auVar95 = vmaxps_avx(auVar84,auVar87);
          uVar21 = vcmpps_avx512vl(auVar95,auVar88,2);
          bVar69 = bVar69 & (byte)uVar21;
          if (bVar69 != 0) {
            auVar51._4_4_ = auVar82._4_4_ * auVar96._4_4_;
            auVar51._0_4_ = auVar82._0_4_ * auVar96._0_4_;
            auVar51._8_4_ = auVar82._8_4_ * auVar96._8_4_;
            auVar51._12_4_ = auVar82._12_4_ * auVar96._12_4_;
            auVar51._16_4_ = auVar82._16_4_ * auVar96._16_4_;
            auVar51._20_4_ = auVar82._20_4_ * auVar96._20_4_;
            auVar51._24_4_ = auVar82._24_4_ * auVar96._24_4_;
            auVar51._28_4_ = auVar95._28_4_;
            auVar17 = vfmsub231ps_fma(auVar51,auVar97,auVar101);
            auVar52._4_4_ = auVar101._4_4_ * auVar98._4_4_;
            auVar52._0_4_ = auVar101._0_4_ * auVar98._0_4_;
            auVar52._8_4_ = auVar101._8_4_ * auVar98._8_4_;
            auVar52._12_4_ = auVar101._12_4_ * auVar98._12_4_;
            auVar52._16_4_ = auVar101._16_4_ * auVar98._16_4_;
            auVar52._20_4_ = auVar101._20_4_ * auVar98._20_4_;
            auVar52._24_4_ = auVar101._24_4_ * auVar98._24_4_;
            auVar52._28_4_ = auVar101._28_4_;
            auVar79 = vfmsub231ps_fma(auVar52,auVar83,auVar82);
            auVar53._4_4_ = auVar97._4_4_ * auVar83._4_4_;
            auVar53._0_4_ = auVar97._0_4_ * auVar83._0_4_;
            auVar53._8_4_ = auVar97._8_4_ * auVar83._8_4_;
            auVar53._12_4_ = auVar97._12_4_ * auVar83._12_4_;
            auVar53._16_4_ = auVar97._16_4_ * auVar83._16_4_;
            auVar53._20_4_ = auVar97._20_4_ * auVar83._20_4_;
            auVar53._24_4_ = auVar97._24_4_ * auVar83._24_4_;
            auVar53._28_4_ = auVar97._28_4_;
            auVar77 = vfmsub231ps_fma(auVar53,auVar98,auVar96);
            auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar77));
            auVar74 = vfmadd231ps_fma(ZEXT1632(auVar76),ZEXT1632(auVar17),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar95 = vrcp14ps_avx512vl(ZEXT1632(auVar74));
            auVar193 = ZEXT3264(auVar95);
            auVar29._8_4_ = 0x3f800000;
            auVar29._0_8_ = 0x3f8000003f800000;
            auVar29._12_4_ = 0x3f800000;
            auVar29._16_4_ = 0x3f800000;
            auVar29._20_4_ = 0x3f800000;
            auVar29._24_4_ = 0x3f800000;
            auVar29._28_4_ = 0x3f800000;
            auVar96 = vfnmadd213ps_avx512vl(auVar95,ZEXT1632(auVar74),auVar29);
            auVar76 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
            auVar186 = ZEXT1664(auVar76);
            auVar54._4_4_ = auVar77._4_4_ * auVar115._4_4_;
            auVar54._0_4_ = auVar77._0_4_ * auVar115._0_4_;
            auVar54._8_4_ = auVar77._8_4_ * auVar115._8_4_;
            auVar54._12_4_ = auVar77._12_4_ * auVar115._12_4_;
            auVar54._16_4_ = fVar161 * 0.0;
            auVar54._20_4_ = fVar146 * 0.0;
            auVar54._24_4_ = fVar147 * 0.0;
            auVar54._28_4_ = iVar1;
            auVar79 = vfmadd231ps_fma(auVar54,auVar100,ZEXT1632(auVar79));
            auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar99,ZEXT1632(auVar17));
            fVar146 = auVar76._0_4_;
            fVar147 = auVar76._4_4_;
            fVar70 = auVar76._8_4_;
            fVar71 = auVar76._12_4_;
            local_280 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar71,
                                           CONCAT48(auVar79._8_4_ * fVar70,
                                                    CONCAT44(auVar79._4_4_ * fVar147,
                                                             auVar79._0_4_ * fVar146))));
            auVar198 = ZEXT3264(local_280);
            uVar21 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar161 = (ray->super_RayK<1>).tfar;
            auVar30._4_4_ = fVar161;
            auVar30._0_4_ = fVar161;
            auVar30._8_4_ = fVar161;
            auVar30._12_4_ = fVar161;
            auVar30._16_4_ = fVar161;
            auVar30._20_4_ = fVar161;
            auVar30._24_4_ = fVar161;
            auVar30._28_4_ = fVar161;
            uVar22 = vcmpps_avx512vl(local_280,auVar30,2);
            bVar69 = (byte)uVar21 & (byte)uVar22 & bVar69;
            if (bVar69 != 0) {
              uVar67 = vcmpps_avx512vl(ZEXT1632(auVar74),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar67 = bVar69 & uVar67;
              if ((char)uVar67 != '\0') {
                fVar161 = auVar84._0_4_ * fVar146;
                fVar124 = auVar84._4_4_ * fVar147;
                auVar55._4_4_ = fVar124;
                auVar55._0_4_ = fVar161;
                fVar125 = auVar84._8_4_ * fVar70;
                auVar55._8_4_ = fVar125;
                fVar128 = auVar84._12_4_ * fVar71;
                auVar55._12_4_ = fVar128;
                fVar129 = auVar84._16_4_ * 0.0;
                auVar55._16_4_ = fVar129;
                fVar132 = auVar84._20_4_ * 0.0;
                auVar55._20_4_ = fVar132;
                fVar133 = auVar84._24_4_ * 0.0;
                auVar55._24_4_ = fVar133;
                auVar55._28_4_ = auVar84._28_4_;
                auVar160._8_4_ = 0x3f800000;
                auVar160._0_8_ = 0x3f8000003f800000;
                auVar160._12_4_ = 0x3f800000;
                auVar160._16_4_ = 0x3f800000;
                auVar160._20_4_ = 0x3f800000;
                auVar160._24_4_ = 0x3f800000;
                auVar160._28_4_ = 0x3f800000;
                auVar95 = vsubps_avx(auVar160,auVar55);
                local_2c0._0_4_ =
                     (float)((uint)(bVar60 & 1) * (int)fVar161 |
                            (uint)!(bool)(bVar60 & 1) * auVar95._0_4_);
                bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar11 * (int)fVar124 | (uint)!bVar11 * auVar95._4_4_);
                bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar11 * (int)fVar125 | (uint)!bVar11 * auVar95._8_4_);
                bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar11 * (int)fVar128 | (uint)!bVar11 * auVar95._12_4_);
                bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar11 * (int)fVar129 | (uint)!bVar11 * auVar95._16_4_);
                bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar11 * (int)fVar132 | (uint)!bVar11 * auVar95._20_4_);
                bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar11 * (int)fVar133 | (uint)!bVar11 * auVar95._24_4_);
                bVar11 = SUB81(uVar61 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar11 * auVar84._28_4_ | (uint)!bVar11 * auVar95._28_4_);
                auVar95 = vsubps_avx(auVar86,auVar85);
                auVar76 = vfmadd213ps_fma(auVar95,local_2c0,auVar85);
                fVar161 = pre->depth_scale;
                auVar31._4_4_ = fVar161;
                auVar31._0_4_ = fVar161;
                auVar31._8_4_ = fVar161;
                auVar31._12_4_ = fVar161;
                auVar31._16_4_ = fVar161;
                auVar31._20_4_ = fVar161;
                auVar31._24_4_ = fVar161;
                auVar31._28_4_ = fVar161;
                auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                             CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                                                      CONCAT44(auVar76._4_4_ +
                                                                               auVar76._4_4_,
                                                                               auVar76._0_4_ +
                                                                               auVar76._0_4_)))),
                                          auVar31);
                uVar23 = vcmpps_avx512vl(local_280,auVar95,6);
                uVar67 = uVar67 & uVar23;
                bVar69 = (byte)uVar67;
                if (bVar69 != 0) {
                  auVar151._0_4_ = auVar87._0_4_ * fVar146;
                  auVar151._4_4_ = auVar87._4_4_ * fVar147;
                  auVar151._8_4_ = auVar87._8_4_ * fVar70;
                  auVar151._12_4_ = auVar87._12_4_ * fVar71;
                  auVar151._16_4_ = auVar87._16_4_ * 0.0;
                  auVar151._20_4_ = auVar87._20_4_ * 0.0;
                  auVar151._24_4_ = auVar87._24_4_ * 0.0;
                  auVar151._28_4_ = 0;
                  auVar174._8_4_ = 0x3f800000;
                  auVar174._0_8_ = 0x3f8000003f800000;
                  auVar174._12_4_ = 0x3f800000;
                  auVar174._16_4_ = 0x3f800000;
                  auVar174._20_4_ = 0x3f800000;
                  auVar174._24_4_ = 0x3f800000;
                  auVar174._28_4_ = 0x3f800000;
                  auVar95 = vsubps_avx(auVar174,auVar151);
                  auVar120._0_4_ =
                       (uint)(bVar60 & 1) * (int)auVar151._0_4_ |
                       (uint)!(bool)(bVar60 & 1) * auVar95._0_4_;
                  bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
                  auVar120._4_4_ =
                       (uint)bVar11 * (int)auVar151._4_4_ | (uint)!bVar11 * auVar95._4_4_;
                  bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
                  auVar120._8_4_ =
                       (uint)bVar11 * (int)auVar151._8_4_ | (uint)!bVar11 * auVar95._8_4_;
                  bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
                  auVar120._12_4_ =
                       (uint)bVar11 * (int)auVar151._12_4_ | (uint)!bVar11 * auVar95._12_4_;
                  bVar11 = (bool)((byte)(uVar61 >> 4) & 1);
                  auVar120._16_4_ =
                       (uint)bVar11 * (int)auVar151._16_4_ | (uint)!bVar11 * auVar95._16_4_;
                  bVar11 = (bool)((byte)(uVar61 >> 5) & 1);
                  auVar120._20_4_ =
                       (uint)bVar11 * (int)auVar151._20_4_ | (uint)!bVar11 * auVar95._20_4_;
                  bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
                  auVar120._24_4_ =
                       (uint)bVar11 * (int)auVar151._24_4_ | (uint)!bVar11 * auVar95._24_4_;
                  auVar120._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar95._28_4_;
                  auVar32._8_4_ = 0x40000000;
                  auVar32._0_8_ = 0x4000000040000000;
                  auVar32._12_4_ = 0x40000000;
                  auVar32._16_4_ = 0x40000000;
                  auVar32._20_4_ = 0x40000000;
                  auVar32._24_4_ = 0x40000000;
                  auVar32._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar120,auVar174,auVar32);
                  local_260 = (int)lVar64;
                  local_25c = iVar9;
                  auVar200 = ZEXT1664(local_4c0);
                  local_250 = local_4c0;
                  auVar201 = ZEXT1664(local_4d0);
                  local_240 = local_4d0;
                  local_230 = local_520;
                  uStack_228 = uStack_518;
                  local_220 = CONCAT44(fStack_52c,local_530);
                  uStack_218 = CONCAT44(fStack_524,fStack_528);
                  pGVar65 = (context->scene->geometries).items[local_550].ptr;
                  if ((pGVar65->mask & (ray->super_RayK<1>).mask) != 0) {
                    uVar66 = (uint)uVar67;
                    auVar76 = vcvtsi2ss_avx512f(auVar81,(int)lVar64);
                    fVar161 = auVar76._0_4_;
                    local_200[0] = (fVar161 + local_2c0._0_4_ + 0.0) * local_100;
                    local_200[1] = (fVar161 + local_2c0._4_4_ + 1.0) * fStack_fc;
                    local_200[2] = (fVar161 + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (fVar161 + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (fVar161 + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (fVar161 + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (fVar161 + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = fVar161 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar143._8_4_ = 0x7f800000;
                    auVar143._0_8_ = 0x7f8000007f800000;
                    auVar143._12_4_ = 0x7f800000;
                    auVar143._16_4_ = 0x7f800000;
                    auVar143._20_4_ = 0x7f800000;
                    auVar143._24_4_ = 0x7f800000;
                    auVar143._28_4_ = 0x7f800000;
                    auVar95 = vblendmps_avx512vl(auVar143,local_280);
                    auVar121._0_4_ =
                         (uint)(bVar69 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000
                    ;
                    bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
                    auVar121._4_4_ = (uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
                    auVar121._8_4_ = (uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
                    auVar121._12_4_ = (uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
                    auVar121._16_4_ = (uint)bVar11 * auVar95._16_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
                    auVar121._20_4_ = (uint)bVar11 * auVar95._20_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
                    auVar121._24_4_ = (uint)bVar11 * auVar95._24_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = SUB81(uVar67 >> 7,0);
                    auVar121._28_4_ = (uint)bVar11 * auVar95._28_4_ | (uint)!bVar11 * 0x7f800000;
                    auVar95 = vshufps_avx(auVar121,auVar121,0xb1);
                    auVar95 = vminps_avx(auVar121,auVar95);
                    auVar96 = vshufpd_avx(auVar95,auVar95,5);
                    auVar95 = vminps_avx(auVar95,auVar96);
                    auVar96 = vpermpd_avx2(auVar95,0x4e);
                    auVar95 = vminps_avx(auVar95,auVar96);
                    uVar21 = vcmpps_avx512vl(auVar121,auVar95,0);
                    if (((byte)uVar21 & bVar69) != 0) {
                      uVar66 = (uint)((byte)uVar21 & bVar69);
                    }
                    uVar63 = 0;
                    for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
                      uVar63 = uVar63 + 1;
                    }
                    uVar61 = (ulong)uVar63;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar65->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_420 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_120 = vmovdqa64_avx512vl(auVar206._0_32_);
                      local_440 = local_280;
                      local_460._0_8_ = pGVar65;
                      do {
                        local_4a4 = local_200[uVar61];
                        local_4a0 = *(undefined4 *)(local_1e0 + uVar61 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar61 * 4);
                        local_500.context = context->user;
                        fVar161 = 1.0 - local_4a4;
                        auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(local_4a4 * (fVar161 + fVar161))),
                                                   ZEXT416((uint)fVar161),ZEXT416((uint)fVar161));
                        auVar74 = ZEXT416((uint)local_4a4);
                        auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar74,
                                                  ZEXT416(0xc0a00000));
                        auVar79 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4 * 3.0)),
                                                  ZEXT416((uint)(local_4a4 + local_4a4)),auVar76);
                        auVar193 = ZEXT1664(auVar79);
                        auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar74,
                                                  ZEXT416(0x40000000));
                        auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161 * -3.0)),
                                                  ZEXT416((uint)(fVar161 + fVar161)),auVar76);
                        auVar74 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4)),auVar74,
                                                  ZEXT416((uint)(fVar161 * -2.0)));
                        fVar161 = auVar17._0_4_ * 0.5;
                        fVar146 = auVar79._0_4_ * 0.5;
                        auVar180 = ZEXT464((uint)fVar146);
                        fVar147 = auVar76._0_4_ * 0.5;
                        fVar70 = auVar74._0_4_ * 0.5;
                        auVar168._0_4_ = fVar70 * local_530;
                        auVar168._4_4_ = fVar70 * fStack_52c;
                        auVar168._8_4_ = fVar70 * fStack_528;
                        auVar168._12_4_ = fVar70 * fStack_524;
                        auVar184._4_4_ = fVar147;
                        auVar184._0_4_ = fVar147;
                        auVar184._8_4_ = fVar147;
                        auVar184._12_4_ = fVar147;
                        auVar58._8_8_ = uStack_518;
                        auVar58._0_8_ = local_520;
                        auVar76 = vfmadd132ps_fma(auVar184,auVar168,auVar58);
                        auVar186 = ZEXT1664(auVar76);
                        auVar169._4_4_ = fVar146;
                        auVar169._0_4_ = fVar146;
                        auVar169._8_4_ = fVar146;
                        auVar169._12_4_ = fVar146;
                        auVar74 = vfmadd213ps_fma(auVar169,auVar201._0_16_,auVar76);
                        auVar157._4_4_ = fVar161;
                        auVar157._0_4_ = fVar161;
                        auVar157._8_4_ = fVar161;
                        auVar157._12_4_ = fVar161;
                        auVar74 = vfmadd213ps_fma(auVar157,auVar200._0_16_,auVar74);
                        local_4b0 = vmovlps_avx(auVar74);
                        local_4a8 = vextractps_avx(auVar74,2);
                        local_49c = (int)local_538;
                        local_498 = (int)local_550;
                        local_494 = (local_500.context)->instID[0];
                        local_490 = (local_500.context)->instPrimID[0];
                        local_554 = -1;
                        local_500.valid = &local_554;
                        local_500.geometryUserPtr = pGVar65->userPtr;
                        local_500.ray = (RTCRayN *)ray;
                        local_500.hit = (RTCHitN *)&local_4b0;
                        local_500.N = 1;
                        if (pGVar65->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ace41c:
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar65->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar180 = ZEXT1664(auVar180._0_16_);
                            auVar186 = ZEXT1664(auVar186._0_16_);
                            auVar193 = ZEXT1664(auVar193._0_16_);
                            (*p_Var10)(&local_500);
                            auVar198 = ZEXT3264(local_440);
                            auVar201 = ZEXT1664(local_4d0);
                            auVar200 = ZEXT1664(local_4c0);
                            pGVar65 = (Geometry *)local_460._0_8_;
                            ray = local_540;
                            context = local_548;
                            if (*local_500.valid == 0) goto LAB_01ace4d3;
                          }
                          (((Vec3f *)((long)local_500.ray + 0x30))->field_0).components[0] =
                               *(float *)local_500.hit;
                          (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_500.hit + 4);
                          (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_500.hit + 8);
                          *(float *)((long)local_500.ray + 0x3c) = *(float *)(local_500.hit + 0xc);
                          *(float *)((long)local_500.ray + 0x40) = *(float *)(local_500.hit + 0x10);
                          *(float *)((long)local_500.ray + 0x44) = *(float *)(local_500.hit + 0x14);
                          *(float *)((long)local_500.ray + 0x48) = *(float *)(local_500.hit + 0x18);
                          *(float *)((long)local_500.ray + 0x4c) = *(float *)(local_500.hit + 0x1c);
                          *(float *)((long)local_500.ray + 0x50) = *(float *)(local_500.hit + 0x20);
                        }
                        else {
                          auVar180 = ZEXT464((uint)fVar146);
                          auVar186 = ZEXT1664(auVar76);
                          auVar193 = ZEXT1664(auVar79);
                          (*pGVar65->intersectionFilterN)(&local_500);
                          auVar198 = ZEXT3264(local_440);
                          auVar201 = ZEXT1664(local_4d0);
                          auVar200 = ZEXT1664(local_4c0);
                          pGVar65 = (Geometry *)local_460._0_8_;
                          ray = local_540;
                          context = local_548;
                          if (*local_500.valid != 0) goto LAB_01ace41c;
LAB_01ace4d3:
                          (local_540->super_RayK<1>).tfar = (float)local_420._0_4_;
                          pGVar65 = (Geometry *)local_460._0_8_;
                          ray = local_540;
                          context = local_548;
                        }
                        bVar69 = ~(byte)(1 << ((uint)uVar61 & 0x1f)) & (byte)uVar67;
                        fVar161 = (ray->super_RayK<1>).tfar;
                        auVar33._4_4_ = fVar161;
                        auVar33._0_4_ = fVar161;
                        auVar33._8_4_ = fVar161;
                        auVar33._12_4_ = fVar161;
                        auVar33._16_4_ = fVar161;
                        auVar33._20_4_ = fVar161;
                        auVar33._24_4_ = fVar161;
                        auVar33._28_4_ = fVar161;
                        uVar21 = vcmpps_avx512vl(auVar198._0_32_,auVar33,2);
                        if ((bVar69 & (byte)uVar21) == 0) goto LAB_01ace573;
                        local_420 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar69 = bVar69 & (byte)uVar21;
                        uVar66 = (uint)bVar69;
                        uVar67 = (ulong)uVar66;
                        auVar144._8_4_ = 0x7f800000;
                        auVar144._0_8_ = 0x7f8000007f800000;
                        auVar144._12_4_ = 0x7f800000;
                        auVar144._16_4_ = 0x7f800000;
                        auVar144._20_4_ = 0x7f800000;
                        auVar144._24_4_ = 0x7f800000;
                        auVar144._28_4_ = 0x7f800000;
                        auVar95 = vblendmps_avx512vl(auVar144,auVar198._0_32_);
                        auVar122._0_4_ =
                             (uint)(bVar69 & 1) * auVar95._0_4_ |
                             (uint)!(bool)(bVar69 & 1) * 0x7f800000;
                        bVar11 = (bool)(bVar69 >> 1 & 1);
                        auVar122._4_4_ = (uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar69 >> 2 & 1);
                        auVar122._8_4_ = (uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar69 >> 3 & 1);
                        auVar122._12_4_ = (uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * 0x7f800000
                        ;
                        bVar11 = (bool)(bVar69 >> 4 & 1);
                        auVar122._16_4_ = (uint)bVar11 * auVar95._16_4_ | (uint)!bVar11 * 0x7f800000
                        ;
                        bVar11 = (bool)(bVar69 >> 5 & 1);
                        auVar122._20_4_ = (uint)bVar11 * auVar95._20_4_ | (uint)!bVar11 * 0x7f800000
                        ;
                        bVar11 = (bool)(bVar69 >> 6 & 1);
                        auVar122._24_4_ = (uint)bVar11 * auVar95._24_4_ | (uint)!bVar11 * 0x7f800000
                        ;
                        auVar122._28_4_ =
                             (uint)(bVar69 >> 7) * auVar95._28_4_ |
                             (uint)!(bool)(bVar69 >> 7) * 0x7f800000;
                        auVar95 = vshufps_avx(auVar122,auVar122,0xb1);
                        auVar95 = vminps_avx(auVar122,auVar95);
                        auVar96 = vshufpd_avx(auVar95,auVar95,5);
                        auVar95 = vminps_avx(auVar95,auVar96);
                        auVar96 = vpermpd_avx2(auVar95,0x4e);
                        auVar95 = vminps_avx(auVar95,auVar96);
                        uVar21 = vcmpps_avx512vl(auVar122,auVar95,0);
                        bVar69 = (byte)uVar21 & bVar69;
                        if (bVar69 != 0) {
                          uVar66 = (uint)bVar69;
                        }
                        uVar63 = 0;
                        for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
                          uVar63 = uVar63 + 1;
                        }
                        uVar61 = (ulong)uVar63;
                      } while( true );
                    }
                    fVar161 = local_200[uVar61];
                    fVar146 = *(float *)(local_1e0 + uVar61 * 4);
                    fVar147 = 1.0 - fVar161;
                    auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar161 * (fVar147 + fVar147))),
                                               ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                    auVar79 = ZEXT416((uint)fVar161);
                    auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                              ZEXT416(0xc0a00000));
                    auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161 * 3.0)),
                                              ZEXT416((uint)(fVar161 + fVar161)),auVar76);
                    auVar193 = ZEXT1664(auVar74);
                    auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar79,
                                              ZEXT416(0x40000000));
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * -3.0)),
                                              ZEXT416((uint)(fVar147 + fVar147)),auVar76);
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),auVar79,
                                              ZEXT416((uint)(fVar147 * -2.0)));
                    fVar147 = auVar17._0_4_ * 0.5;
                    fVar70 = auVar74._0_4_ * 0.5;
                    fVar71 = auVar76._0_4_ * 0.5;
                    fVar124 = auVar79._0_4_ * 0.5;
                    auVar166._0_4_ = fVar124 * local_530;
                    auVar166._4_4_ = fVar124 * fStack_52c;
                    auVar166._8_4_ = fVar124 * fStack_528;
                    auVar166._12_4_ = fVar124 * fStack_524;
                    auVar183._4_4_ = fVar71;
                    auVar183._0_4_ = fVar71;
                    auVar183._8_4_ = fVar71;
                    auVar183._12_4_ = fVar71;
                    auVar57._8_8_ = uStack_518;
                    auVar57._0_8_ = local_520;
                    auVar76 = vfmadd132ps_fma(auVar183,auVar166,auVar57);
                    auVar186 = ZEXT1664(auVar76);
                    auVar167._4_4_ = fVar70;
                    auVar167._0_4_ = fVar70;
                    auVar167._8_4_ = fVar70;
                    auVar167._12_4_ = fVar70;
                    auVar76 = vfmadd213ps_fma(auVar167,local_4d0,auVar76);
                    auVar156._4_4_ = fVar147;
                    auVar156._0_4_ = fVar147;
                    auVar156._8_4_ = fVar147;
                    auVar156._12_4_ = fVar147;
                    auVar180 = ZEXT464((uint)*(float *)(local_1c0 + uVar61 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar61 * 4);
                    auVar76 = vfmadd213ps_fma(auVar156,local_4c0,auVar76);
                    uVar21 = vmovlps_avx(auVar76);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                    fVar147 = (float)vextractps_avx(auVar76,2);
                    (ray->Ng).field_0.field_0.z = fVar147;
                    ray->u = fVar161;
                    ray->v = fVar146;
                    ray->primID = (uint)local_538;
                    ray->geomID = (uint)local_550;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01ace22a;
      }
LAB_01acd8e7:
      fVar161 = (ray->super_RayK<1>).tfar;
      auVar26._4_4_ = fVar161;
      auVar26._0_4_ = fVar161;
      auVar26._8_4_ = fVar161;
      auVar26._12_4_ = fVar161;
      uVar21 = vcmpps_avx512vl(local_190,auVar26,2);
      uVar66 = (uint)uVar68 & (uint)uVar21;
      uVar68 = (ulong)uVar66;
    } while (uVar66 != 0);
  }
  return;
LAB_01ace573:
  auVar210 = ZEXT3264(local_480);
  auVar95 = vmovdqa64_avx512vl(local_120);
  auVar206 = ZEXT3264(auVar95);
  prim = local_508;
  pre = local_510;
LAB_01ace22a:
  lVar64 = lVar64 + 8;
  if (iVar9 <= (int)lVar64) goto LAB_01acd8e7;
  goto LAB_01acd970;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }